

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::Swish_x86_avx::forward_inplace(Swish_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined4 uVar13;
  undefined4 uVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [24];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [24];
  undefined1 (*pauVar57) [32];
  long in_RSI;
  double dVar58;
  float fVar59;
  float fVar60;
  __m128 _p_3;
  __m256 _p_2;
  int i_2;
  float *ptr_2;
  int q_2;
  __m128 _p_1;
  int i_1;
  float *ptr_1;
  int q_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int h;
  int w;
  __m256 one;
  __m256 one_4;
  __m256 pow2n_2;
  __m256 y_2;
  __m256 z_2;
  __m256 mask_2;
  __m256 one_5;
  __m256i imm0_1;
  __m256 fx_2;
  __m256 tmp_2;
  __m256 pow2n;
  __m256 y;
  __m256 z;
  __m256 mask;
  __m256 one_1;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_7;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  __m256i ret_3;
  __m128i x2_3;
  __m128i x1_3;
  __m128 one_2;
  __m128 one_6;
  v4sf pow2n_3;
  v4sf y_3;
  v4sf z_3;
  v4sf mask_3;
  v4sf one_7;
  v4si emm0_1;
  v4sf fx_3;
  v4sf tmp_3;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf z_1;
  v4sf mask_1;
  v4sf one_3;
  v4si emm0;
  v4sf fx_1;
  v4sf tmp_1;
  undefined8 in_stack_ffffffffffffdaa8;
  Mat *this_00;
  Mat *in_stack_ffffffffffffdab0;
  int local_24ec;
  Mat local_24e8;
  undefined1 (*local_24a0) [32];
  int local_2494;
  void *local_2490;
  int *piStack_2488;
  int local_247c;
  Mat local_2478;
  Mat *local_2430;
  int local_2424;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  int local_23e8;
  Mat local_23d8;
  undefined1 (*local_2390) [32];
  int local_2388;
  int local_2384;
  int local_2380;
  int local_237c;
  int local_2378;
  int local_2374;
  undefined1 (*local_2350) [32];
  undefined1 (*local_2348) [32];
  float local_2340;
  float fStack_233c;
  float fStack_2338;
  float fStack_2334;
  float fStack_2330;
  float fStack_232c;
  float fStack_2328;
  undefined4 uStack_2324;
  undefined1 (*local_2308) [32];
  float local_2300;
  float fStack_22fc;
  float fStack_22f8;
  float fStack_22f4;
  float fStack_22f0;
  float fStack_22ec;
  float fStack_22e8;
  undefined4 uStack_22e4;
  undefined1 (*local_22c8) [32];
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined1 (*local_2270) [32];
  Mat *local_2268;
  float local_2260;
  float fStack_225c;
  float fStack_2258;
  float fStack_2254;
  undefined1 (*local_2248) [32];
  float local_2240;
  float fStack_223c;
  float fStack_2238;
  float fStack_2234;
  Mat *local_2228;
  undefined8 local_2220;
  undefined8 uStack_2218;
  void *local_2210;
  int *piStack_2208;
  undefined1 local_2200 [8];
  float fStack_21f8;
  float fStack_21f4;
  float fStack_21f0;
  float fStack_21ec;
  float fStack_21e8;
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined1 local_21c0 [8];
  float fStack_21b8;
  float fStack_21b4;
  float fStack_21b0;
  float fStack_21ac;
  float fStack_21a8;
  undefined1 local_21a0 [8];
  float fStack_2198;
  float fStack_2194;
  float fStack_2190;
  float fStack_218c;
  float fStack_2188;
  undefined4 uStack_2184;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined1 local_2120 [32];
  undefined4 local_20e8;
  undefined4 local_20e4;
  float local_20e0;
  float fStack_20dc;
  float fStack_20d8;
  float fStack_20d4;
  float fStack_20d0;
  float fStack_20cc;
  float fStack_20c8;
  float fStack_20c4;
  undefined1 local_20c0 [32];
  float local_20a0;
  float fStack_209c;
  float fStack_2098;
  float fStack_2094;
  float fStack_2090;
  float fStack_208c;
  float fStack_2088;
  float fStack_2084;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined1 local_2040 [8];
  float fStack_2038;
  float fStack_2034;
  float fStack_2030;
  float fStack_202c;
  float fStack_2028;
  float fStack_2024;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  float local_1fc0;
  float fStack_1fbc;
  float fStack_1fb8;
  float fStack_1fb4;
  float fStack_1fb0;
  float fStack_1fac;
  float fStack_1fa8;
  float fStack_1fa4;
  float local_1fa0;
  float fStack_1f9c;
  float fStack_1f98;
  float fStack_1f94;
  float fStack_1f90;
  float fStack_1f8c;
  float fStack_1f88;
  float fStack_1f84;
  undefined1 local_1f80 [32];
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined1 local_1f20 [8];
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined1 local_1f00 [8];
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined1 local_1ee0 [32];
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined1 local_1ea0 [32];
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  float local_19c0;
  float fStack_19bc;
  float fStack_19b8;
  float fStack_19b4;
  float fStack_19b0;
  float fStack_19ac;
  float fStack_19a8;
  float fStack_19a4;
  undefined1 local_19a0 [32];
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined1 local_1940 [8];
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined1 local_1920 [8];
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined1 local_1900 [32];
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  ulong uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  ulong uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [16];
  undefined1 auStack_1190 [16];
  undefined4 local_1180;
  undefined4 local_117c;
  undefined4 local_1178;
  undefined4 local_1174;
  undefined4 local_1170;
  undefined4 local_116c;
  undefined4 local_1168;
  undefined4 local_1164;
  undefined1 local_1160 [16];
  undefined1 auStack_1150 [16];
  undefined4 local_1140;
  undefined4 local_113c;
  undefined4 local_1138;
  undefined4 local_1134;
  undefined4 local_1130;
  undefined4 local_112c;
  undefined4 local_1128;
  undefined4 local_1124;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 local_ed0;
  undefined8 uStack_ec8;
  undefined1 local_ec0 [16];
  undefined1 local_eb0 [16];
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 local_dd0;
  undefined8 uStack_dc8;
  undefined1 local_dc0 [16];
  undefined1 local_db0 [16];
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined1 local_cf0 [16];
  undefined1 local_ce0 [16];
  undefined4 local_cc4;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined1 local_c30 [16];
  undefined1 local_c20 [16];
  undefined4 local_c04;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 local_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 local_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined4 local_b04;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined4 local_ae4;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined4 local_ac4;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined4 local_aa4;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined1 local_a90 [8];
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined1 local_a70 [8];
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  undefined8 local_a50;
  undefined8 uStack_a48;
  undefined1 local_a40 [16];
  undefined8 local_a30;
  undefined8 uStack_a28;
  undefined1 local_a20 [16];
  undefined4 local_a10;
  undefined4 uStack_a0c;
  undefined4 uStack_a08;
  undefined4 uStack_a04;
  undefined4 local_9f4;
  undefined4 local_9f0;
  undefined4 uStack_9ec;
  undefined4 uStack_9e8;
  undefined4 uStack_9e4;
  undefined4 local_9d4;
  float local_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [16];
  float local_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [16];
  undefined8 local_990;
  undefined8 uStack_988;
  undefined1 local_980 [16];
  undefined8 local_970;
  undefined8 uStack_968;
  undefined1 local_960 [16];
  undefined8 local_950;
  undefined8 uStack_948;
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float local_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [16];
  undefined8 local_910;
  undefined8 uStack_908;
  undefined1 local_900 [16];
  undefined1 local_8f0 [8];
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined1 local_8d0 [16];
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined4 local_894;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined1 local_870 [16];
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  float local_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  undefined1 local_5f0 [16];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [8];
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [16];
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined4 local_564;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined1 local_540 [16];
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  ulong uStack_218;
  void *local_210;
  int *piStack_208;
  undefined8 local_200;
  ulong uStack_1f8;
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined1 auVar14 [16];
  
  local_2374 = *(int *)(in_RSI + 0x2c);
  local_2378 = *(int *)(in_RSI + 0x30);
  local_237c = *(int *)(in_RSI + 0x38);
  local_2380 = local_2374 * local_2378;
  local_2384 = *(int *)(in_RSI + 0x18);
  if (local_2384 == 8) {
    local_2384 = 8;
    for (local_2388 = 0; local_2388 < local_237c; local_2388 = local_2388 + 1) {
      ncnn::Mat::channel(in_stack_ffffffffffffdab0,(int)((ulong)in_stack_ffffffffffffdaa8 >> 0x20));
      pauVar57 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_23d8);
      ncnn::Mat::~Mat((Mat *)0x9029c4);
      local_2390 = pauVar57;
      for (local_23e8 = 0; local_23e8 < local_2380; local_23e8 = local_23e8 + 1) {
        local_2348 = local_2390;
        local_2420 = *(undefined8 *)*local_2390;
        uStack_2418 = *(undefined8 *)(*local_2390 + 8);
        uStack_2410 = *(undefined8 *)(*local_2390 + 0x10);
        uStack_2408 = *(undefined8 *)(*local_2390 + 0x18);
        local_22c8 = local_2390;
        local_20e4 = 0x3f800000;
        local_1180 = 0x3f800000;
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        local_11a0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        auStack_1190 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        local_2180 = local_11a0._0_8_;
        uStack_2178 = local_11a0._8_8_;
        uStack_2170 = auStack_1190._0_8_;
        uStack_2168 = auStack_1190._8_8_;
        local_2080 = local_11a0._0_8_;
        uStack_2078 = local_11a0._8_8_;
        uStack_2070 = auStack_1190._0_8_;
        uStack_2068 = auStack_1190._8_8_;
        local_1220 = ZEXT832(0) << 0x20;
        local_1240 = 0;
        local_11c0._8_8_ = SUB328(ZEXT832(0),4);
        uStack_1238 = local_11c0._8_8_;
        uStack_1230 = 0;
        uStack_1228 = 0;
        auVar6 = vsubps_avx(ZEXT832((ulong)local_11c0._8_8_) << 0x40,*local_2390);
        local_1980 = 0x3f8000003f800000;
        uStack_1978 = 0x3f8000003f800000;
        uStack_1970 = 0x3f8000003f800000;
        uStack_1968 = 0x3f8000003f800000;
        local_1900._0_8_ = auVar6._0_8_;
        local_1100 = local_1900._0_8_;
        local_1900._8_8_ = auVar6._8_8_;
        uStack_10f8 = local_1900._8_8_;
        local_1900._16_8_ = auVar6._16_8_;
        uStack_10f0 = local_1900._16_8_;
        local_1900._24_8_ = auVar6._24_8_;
        uStack_10e8 = local_1900._24_8_;
        local_1120 = 0x42b0c0a542b0c0a5;
        uStack_1118 = 0x42b0c0a542b0c0a5;
        uStack_1110 = 0x42b0c0a542b0c0a5;
        uStack_1108 = 0x42b0c0a542b0c0a5;
        auVar21._8_8_ = 0x42b0c0a542b0c0a5;
        auVar21._0_8_ = 0x42b0c0a542b0c0a5;
        auVar21._16_8_ = 0x42b0c0a542b0c0a5;
        auVar21._24_8_ = 0x42b0c0a542b0c0a5;
        auVar6 = vminps_avx(auVar6,auVar21);
        local_1900._0_8_ = auVar6._0_8_;
        local_1080 = local_1900._0_8_;
        local_1900._8_8_ = auVar6._8_8_;
        uStack_1078 = local_1900._8_8_;
        local_1900._16_8_ = auVar6._16_8_;
        uStack_1070 = local_1900._16_8_;
        local_1900._24_8_ = auVar6._24_8_;
        uStack_1068 = local_1900._24_8_;
        local_10a0 = 0xc2b0c0a5c2b0c0a5;
        uStack_1098 = 0xc2b0c0a5c2b0c0a5;
        uStack_1090 = 0xc2b0c0a5c2b0c0a5;
        uStack_1088 = 0xc2b0c0a5c2b0c0a5;
        auVar23._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar23._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar23._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar23._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar4 = vmaxps_avx(auVar6,auVar23);
        local_1900._0_8_ = auVar4._0_8_;
        uVar7 = local_1900._0_8_;
        local_1900._8_8_ = auVar4._8_8_;
        uVar8 = local_1900._8_8_;
        local_1900._16_8_ = auVar4._16_8_;
        uVar9 = local_1900._16_8_;
        local_1900._24_8_ = auVar4._24_8_;
        uVar10 = local_1900._24_8_;
        local_1660 = 0x3fb8aa3b3fb8aa3b;
        uStack_1658 = 0x3fb8aa3b3fb8aa3b;
        uStack_1650 = 0x3fb8aa3b3fb8aa3b;
        uStack_1648 = 0x3fb8aa3b3fb8aa3b;
        local_1640._0_4_ = auVar4._0_4_;
        local_1640._4_4_ = auVar4._4_4_;
        uStack_1638._0_4_ = auVar4._8_4_;
        uStack_1638._4_4_ = auVar4._12_4_;
        uStack_1630._0_4_ = auVar4._16_4_;
        uStack_1630._4_4_ = auVar4._20_4_;
        uStack_1628._0_4_ = auVar4._24_4_;
        uStack_1628._4_4_ = auVar4._28_4_;
        local_1940._4_4_ = local_1640._4_4_ * 1.442695;
        local_1940._0_4_ = (float)local_1640 * 1.442695;
        uStack_1938._0_4_ = (float)uStack_1638 * 1.442695;
        uStack_1938._4_4_ = uStack_1638._4_4_ * 1.442695;
        uStack_1930._0_4_ = (float)uStack_1630 * 1.442695;
        uStack_1930._4_4_ = uStack_1630._4_4_ * 1.442695;
        auVar52 = _local_1940;
        uStack_1928._0_4_ = (float)uStack_1628 * 1.442695;
        uStack_1928._4_4_ = uStack_1628._4_4_;
        auVar6 = _local_1940;
        local_1440 = local_1940;
        uStack_1438 = uStack_1938;
        uStack_1930 = auVar52._16_8_;
        uStack_1430 = uStack_1930;
        uStack_1928 = auVar6._24_8_;
        uStack_1428 = uStack_1928;
        local_15a0 = 0x3f0000003f000000;
        uStack_1598 = 0x3f0000003f000000;
        uStack_1590 = 0x3f0000003f000000;
        uStack_1588 = 0x3f0000003f000000;
        local_1940._4_4_ = local_1640._4_4_ * 1.442695 + 0.5;
        local_1940._0_4_ = (float)local_1640 * 1.442695 + 0.5;
        uStack_1938._0_4_ = (float)uStack_1638 * 1.442695 + 0.5;
        uStack_1938._4_4_ = uStack_1638._4_4_ * 1.442695 + 0.5;
        uStack_1930._0_4_ = (float)uStack_1630 * 1.442695 + 0.5;
        uStack_1930._4_4_ = uStack_1630._4_4_ * 1.442695 + 0.5;
        uStack_1928._0_4_ = (float)uStack_1628 * 1.442695 + 0.5;
        uStack_1928._4_4_ = uStack_1628._4_4_ + 0.5;
        auVar5 = vroundps_avx(_local_1940,1);
        auVar6 = vcmpps_avx(_local_1940,auVar5,1);
        local_19a0._0_8_ = auVar6._0_8_;
        local_1000 = local_19a0._0_8_;
        local_19a0._8_8_ = auVar6._8_8_;
        uStack_ff8 = local_19a0._8_8_;
        local_19a0._16_8_ = auVar6._16_8_;
        uStack_ff0 = local_19a0._16_8_;
        local_19a0._24_8_ = auVar6._24_8_;
        uStack_fe8 = local_19a0._24_8_;
        local_1020 = 0x3f8000003f800000;
        uStack_1018 = 0x3f8000003f800000;
        uStack_1010 = 0x3f8000003f800000;
        uStack_1008 = 0x3f8000003f800000;
        auVar25._8_8_ = 0x3f8000003f800000;
        auVar25._0_8_ = 0x3f8000003f800000;
        auVar25._16_8_ = 0x3f8000003f800000;
        auVar25._24_8_ = 0x3f8000003f800000;
        local_19a0 = vandps_avx(auVar6,auVar25);
        local_1920 = auVar5._0_8_;
        local_1380 = local_1920;
        uStack_1918 = auVar5._8_8_;
        uStack_1378 = uStack_1918;
        uStack_1910 = auVar5._16_8_;
        uStack_1370 = uStack_1910;
        uStack_1908 = auVar5._24_8_;
        uStack_1368 = uStack_1908;
        local_13a0 = local_19a0._0_8_;
        uStack_1398 = local_19a0._8_8_;
        uStack_1390 = local_19a0._16_8_;
        uStack_1388 = local_19a0._24_8_;
        _local_1940 = vsubps_avx(auVar5,local_19a0);
        local_16a0 = 0x3f3180003f318000;
        uStack_1698 = 0x3f3180003f318000;
        uStack_1690 = 0x3f3180003f318000;
        uStack_1688 = 0x3f3180003f318000;
        local_1680._0_4_ = local_1940._0_4_;
        local_1680._4_4_ = local_1940._4_4_;
        uStack_1678._0_4_ = local_1940._8_4_;
        uStack_1678._4_4_ = local_1940._12_4_;
        uStack_1670._0_4_ = local_1940._16_4_;
        uStack_1670._4_4_ = local_1940._20_4_;
        uStack_1668._0_4_ = local_1940._24_4_;
        uStack_1668._4_4_ = local_1940._28_4_;
        local_1920._4_4_ = local_1680._4_4_ * 0.6933594;
        local_1920._0_4_ = (float)local_1680 * 0.6933594;
        uStack_1918._0_4_ = (float)uStack_1678 * 0.6933594;
        uStack_1918._4_4_ = uStack_1678._4_4_ * 0.6933594;
        uStack_1910._0_4_ = (float)uStack_1670 * 0.6933594;
        uStack_1910._4_4_ = uStack_1670._4_4_ * 0.6933594;
        auVar52 = _local_1920;
        uStack_1908._0_4_ = (float)uStack_1668 * 0.6933594;
        uStack_1908._4_4_ = uStack_1668._4_4_;
        auVar5 = _local_1920;
        local_16c0 = local_1940;
        uStack_16b8 = uStack_1938;
        uStack_16b0 = uStack_1930;
        uStack_16a8 = uStack_1928;
        local_16e0 = 0xb95e8083b95e8083;
        uStack_16d8 = 0xb95e8083b95e8083;
        uStack_16d0 = 0xb95e8083b95e8083;
        uStack_16c8 = 0xb95e8083b95e8083;
        local_13c0 = local_1900._0_8_;
        uStack_13b8 = local_1900._8_8_;
        uStack_13b0 = local_1900._16_8_;
        uStack_13a8 = local_1900._24_8_;
        local_13e0 = local_1920;
        uStack_13d8 = uStack_1918;
        uStack_1910 = auVar52._16_8_;
        uStack_13d0 = uStack_1910;
        uStack_1908 = auVar5._24_8_;
        uStack_13c8 = uStack_1908;
        auVar19._16_8_ = uStack_1910;
        auVar19._0_16_ = _local_1920;
        auVar19._24_8_ = uStack_1908;
        auVar6 = vsubps_avx(auVar4,auVar19);
        local_1900._0_8_ = auVar6._0_8_;
        local_1400 = local_1900._0_8_;
        local_1900._8_8_ = auVar6._8_8_;
        uStack_13f8 = local_1900._8_8_;
        local_1900._16_8_ = auVar6._16_8_;
        uStack_13f0 = local_1900._16_8_;
        local_1900._24_8_ = auVar6._24_8_;
        uStack_13e8 = local_1900._24_8_;
        local_1420 = CONCAT44(local_1680._4_4_ * -0.00021219444,(float)local_1680 * -0.00021219444);
        uStack_1418 = CONCAT44(uStack_1678._4_4_ * -0.00021219444,
                               (float)uStack_1678 * -0.00021219444);
        uStack_1410 = CONCAT44(uStack_1670._4_4_ * -0.00021219444,
                               (float)uStack_1670 * -0.00021219444);
        uStack_1408 = CONCAT44(uStack_1668._4_4_,(float)uStack_1668 * -0.00021219444);
        auVar18._8_8_ = uStack_1418;
        auVar18._0_8_ = local_1420;
        auVar18._16_8_ = uStack_1410;
        auVar18._24_8_ = uStack_1408;
        local_1900 = vsubps_avx(auVar6,auVar18);
        local_1720 = local_1900._0_8_;
        uStack_1718 = local_1900._8_8_;
        uStack_1710 = local_1900._16_8_;
        uStack_1708 = local_1900._24_8_;
        local_1700._0_4_ = local_1900._0_4_;
        local_1700._4_4_ = local_1900._4_4_;
        uStack_16f8._0_4_ = local_1900._8_4_;
        uStack_16f8._4_4_ = local_1900._12_4_;
        uStack_16f0._0_4_ = local_1900._16_4_;
        uStack_16f0._4_4_ = local_1900._20_4_;
        uStack_16e8._0_4_ = local_1900._24_4_;
        uStack_16e8._4_4_ = local_1900._28_4_;
        fStack_19a4 = uStack_16e8._4_4_;
        local_19c0 = (float)local_1700 * (float)local_1700;
        fStack_19bc = local_1700._4_4_ * local_1700._4_4_;
        fStack_19b8 = (float)uStack_16f8 * (float)uStack_16f8;
        fStack_19b4 = uStack_16f8._4_4_ * uStack_16f8._4_4_;
        fStack_19b0 = (float)uStack_16f0 * (float)uStack_16f0;
        fStack_19ac = uStack_16f0._4_4_ * uStack_16f0._4_4_;
        fStack_19a8 = (float)uStack_16e8 * (float)uStack_16e8;
        local_1740 = 0x3950696739506967;
        uStack_1738 = 0x3950696739506967;
        uStack_1730 = 0x3950696739506967;
        uStack_1728 = 0x3950696739506967;
        local_1760 = local_1900._0_8_;
        uStack_1758 = local_1900._8_8_;
        uStack_1750 = local_1900._16_8_;
        uStack_1748 = local_1900._24_8_;
        local_19e0 = CONCAT44(local_1700._4_4_ * 0.00019875691,(float)local_1700 * 0.00019875691);
        uStack_19d8 = CONCAT44(uStack_16f8._4_4_ * 0.00019875691,(float)uStack_16f8 * 0.00019875691)
        ;
        uStack_19d0 = CONCAT44(uStack_16f0._4_4_ * 0.00019875691,(float)uStack_16f0 * 0.00019875691)
        ;
        uStack_19c8 = CONCAT44(0x39506967,(float)uStack_16e8 * 0.00019875691);
        local_1480 = local_19e0;
        uStack_1478 = uStack_19d8;
        uStack_1470 = uStack_19d0;
        uStack_1468 = uStack_19c8;
        local_14a0 = 0x3ab743ce3ab743ce;
        uStack_1498 = 0x3ab743ce3ab743ce;
        uStack_1490 = 0x3ab743ce3ab743ce;
        uStack_1488 = 0x3ab743ce3ab743ce;
        local_20a0 = (float)local_1700 * 0.00019875691 + 0.0013981999;
        fStack_209c = local_1700._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_2098 = (float)uStack_16f8 * 0.00019875691 + 0.0013981999;
        fStack_2094 = uStack_16f8._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_2090 = (float)uStack_16f0 * 0.00019875691 + 0.0013981999;
        fStack_208c = uStack_16f0._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_2088 = (float)uStack_16e8 * 0.00019875691 + 0.0013981999;
        local_19e0 = CONCAT44(fStack_209c,local_20a0);
        uStack_19d8 = CONCAT44(fStack_2094,fStack_2098);
        uStack_19d0 = CONCAT44(fStack_208c,fStack_2090);
        uStack_19c8 = CONCAT44(0x3ad150fb,fStack_2088);
        local_1780 = local_19e0;
        uStack_1778 = uStack_19d8;
        uStack_1770 = uStack_19d0;
        uStack_1768 = uStack_19c8;
        local_17a0 = local_1900._0_8_;
        uStack_1798 = local_1900._8_8_;
        uStack_1790 = local_1900._16_8_;
        uStack_1788 = local_1900._24_8_;
        local_20a0 = local_20a0 * (float)local_1700;
        fStack_209c = fStack_209c * local_1700._4_4_;
        fStack_2098 = fStack_2098 * (float)uStack_16f8;
        fStack_2094 = fStack_2094 * uStack_16f8._4_4_;
        fStack_2090 = fStack_2090 * (float)uStack_16f0;
        fStack_208c = fStack_208c * uStack_16f0._4_4_;
        fStack_2088 = fStack_2088 * (float)uStack_16e8;
        local_19e0 = CONCAT44(fStack_209c,local_20a0);
        uStack_19d8 = CONCAT44(fStack_2094,fStack_2098);
        uStack_19d0 = CONCAT44(fStack_208c,fStack_2090);
        uStack_19c8 = CONCAT44(0x3ad150fb,fStack_2088);
        local_14c0 = local_19e0;
        uStack_14b8 = uStack_19d8;
        uStack_14b0 = uStack_19d0;
        uStack_14a8 = uStack_19c8;
        local_14e0 = 0x3c0889083c088908;
        uStack_14d8 = 0x3c0889083c088908;
        uStack_14d0 = 0x3c0889083c088908;
        uStack_14c8 = 0x3c0889083c088908;
        local_20a0 = local_20a0 + 0.008333452;
        fStack_209c = fStack_209c + 0.008333452;
        fStack_2098 = fStack_2098 + 0.008333452;
        fStack_2094 = fStack_2094 + 0.008333452;
        fStack_2090 = fStack_2090 + 0.008333452;
        fStack_208c = fStack_208c + 0.008333452;
        fStack_2088 = fStack_2088 + 0.008333452;
        local_19e0 = CONCAT44(fStack_209c,local_20a0);
        uStack_19d8 = CONCAT44(fStack_2094,fStack_2098);
        uStack_19d0 = CONCAT44(fStack_208c,fStack_2090);
        uStack_19c8 = CONCAT44(0x3c22b327,fStack_2088);
        local_17c0 = local_19e0;
        uStack_17b8 = uStack_19d8;
        uStack_17b0 = uStack_19d0;
        uStack_17a8 = uStack_19c8;
        local_17e0 = local_1900._0_8_;
        uStack_17d8 = local_1900._8_8_;
        uStack_17d0 = local_1900._16_8_;
        uStack_17c8 = local_1900._24_8_;
        local_20a0 = local_20a0 * (float)local_1700;
        fStack_209c = fStack_209c * local_1700._4_4_;
        fStack_2098 = fStack_2098 * (float)uStack_16f8;
        fStack_2094 = fStack_2094 * uStack_16f8._4_4_;
        fStack_2090 = fStack_2090 * (float)uStack_16f0;
        fStack_208c = fStack_208c * uStack_16f0._4_4_;
        fStack_2088 = fStack_2088 * (float)uStack_16e8;
        local_19e0 = CONCAT44(fStack_209c,local_20a0);
        uStack_19d8 = CONCAT44(fStack_2094,fStack_2098);
        uStack_19d0 = CONCAT44(fStack_208c,fStack_2090);
        uStack_19c8 = CONCAT44(0x3c22b327,fStack_2088);
        local_1500 = local_19e0;
        uStack_14f8 = uStack_19d8;
        uStack_14f0 = uStack_19d0;
        uStack_14e8 = uStack_19c8;
        local_1520 = 0x3d2aa9c13d2aa9c1;
        uStack_1518 = 0x3d2aa9c13d2aa9c1;
        uStack_1510 = 0x3d2aa9c13d2aa9c1;
        uStack_1508 = 0x3d2aa9c13d2aa9c1;
        local_20a0 = local_20a0 + 0.041665796;
        fStack_209c = fStack_209c + 0.041665796;
        fStack_2098 = fStack_2098 + 0.041665796;
        fStack_2094 = fStack_2094 + 0.041665796;
        fStack_2090 = fStack_2090 + 0.041665796;
        fStack_208c = fStack_208c + 0.041665796;
        fStack_2088 = fStack_2088 + 0.041665796;
        local_19e0 = CONCAT44(fStack_209c,local_20a0);
        uStack_19d8 = CONCAT44(fStack_2094,fStack_2098);
        uStack_19d0 = CONCAT44(fStack_208c,fStack_2090);
        uStack_19c8 = CONCAT44(0x3d53568b,fStack_2088);
        local_1800 = local_19e0;
        uStack_17f8 = uStack_19d8;
        uStack_17f0 = uStack_19d0;
        uStack_17e8 = uStack_19c8;
        local_1820 = local_1900._0_8_;
        uStack_1818 = local_1900._8_8_;
        uStack_1810 = local_1900._16_8_;
        uStack_1808 = local_1900._24_8_;
        local_20a0 = local_20a0 * (float)local_1700;
        fStack_209c = fStack_209c * local_1700._4_4_;
        fStack_2098 = fStack_2098 * (float)uStack_16f8;
        fStack_2094 = fStack_2094 * uStack_16f8._4_4_;
        fStack_2090 = fStack_2090 * (float)uStack_16f0;
        fStack_208c = fStack_208c * uStack_16f0._4_4_;
        fStack_2088 = fStack_2088 * (float)uStack_16e8;
        local_19e0 = CONCAT44(fStack_209c,local_20a0);
        uStack_19d8 = CONCAT44(fStack_2094,fStack_2098);
        uStack_19d0 = CONCAT44(fStack_208c,fStack_2090);
        uStack_19c8 = CONCAT44(0x3d53568b,fStack_2088);
        local_1540 = local_19e0;
        uStack_1538 = uStack_19d8;
        uStack_1530 = uStack_19d0;
        uStack_1528 = uStack_19c8;
        local_1560 = 0x3e2aaaaa3e2aaaaa;
        uStack_1558 = 0x3e2aaaaa3e2aaaaa;
        uStack_1550 = 0x3e2aaaaa3e2aaaaa;
        uStack_1548 = 0x3e2aaaaa3e2aaaaa;
        local_20a0 = local_20a0 + 0.16666666;
        fStack_209c = fStack_209c + 0.16666666;
        fStack_2098 = fStack_2098 + 0.16666666;
        fStack_2094 = fStack_2094 + 0.16666666;
        fStack_2090 = fStack_2090 + 0.16666666;
        fStack_208c = fStack_208c + 0.16666666;
        fStack_2088 = fStack_2088 + 0.16666666;
        local_19e0 = CONCAT44(fStack_209c,local_20a0);
        uStack_19d8 = CONCAT44(fStack_2094,fStack_2098);
        uStack_19d0 = CONCAT44(fStack_208c,fStack_2090);
        uStack_19c8 = CONCAT44(0x3e5f804d,fStack_2088);
        local_1840 = local_19e0;
        uStack_1838 = uStack_19d8;
        uStack_1830 = uStack_19d0;
        uStack_1828 = uStack_19c8;
        local_1860 = local_1900._0_8_;
        uStack_1858 = local_1900._8_8_;
        uStack_1850 = local_1900._16_8_;
        uStack_1848 = local_1900._24_8_;
        local_20a0 = local_20a0 * (float)local_1700;
        fStack_209c = fStack_209c * local_1700._4_4_;
        fStack_2098 = fStack_2098 * (float)uStack_16f8;
        fStack_2094 = fStack_2094 * uStack_16f8._4_4_;
        fStack_2090 = fStack_2090 * (float)uStack_16f0;
        fStack_208c = fStack_208c * uStack_16f0._4_4_;
        fStack_2088 = fStack_2088 * (float)uStack_16e8;
        local_19e0 = CONCAT44(fStack_209c,local_20a0);
        uStack_19d8 = CONCAT44(fStack_2094,fStack_2098);
        uStack_19d0 = CONCAT44(fStack_208c,fStack_2090);
        uStack_19c8 = CONCAT44(0x3e5f804d,fStack_2088);
        local_1580 = local_19e0;
        uStack_1578 = uStack_19d8;
        uStack_1570 = uStack_19d0;
        uStack_1568 = uStack_19c8;
        local_20a0 = local_20a0 + 0.5;
        fStack_209c = fStack_209c + 0.5;
        fStack_2098 = fStack_2098 + 0.5;
        fStack_2094 = fStack_2094 + 0.5;
        fStack_2090 = fStack_2090 + 0.5;
        fStack_208c = fStack_208c + 0.5;
        fStack_2088 = fStack_2088 + 0.5;
        local_19e0 = CONCAT44(fStack_209c,local_20a0);
        uStack_19d8 = CONCAT44(fStack_2094,fStack_2098);
        uStack_19d0 = CONCAT44(fStack_208c,fStack_2090);
        uStack_19c8 = CONCAT44(0x3f37e013,fStack_2088);
        local_1880 = local_19e0;
        uStack_1878 = uStack_19d8;
        uStack_1870 = uStack_19d0;
        uStack_1868 = uStack_19c8;
        local_18a0 = CONCAT44(fStack_19bc,local_19c0);
        uStack_1898 = CONCAT44(fStack_19b4,fStack_19b8);
        uStack_1890 = CONCAT44(fStack_19ac,fStack_19b0);
        uStack_1888 = CONCAT44(uStack_16e8._4_4_,fStack_19a8);
        local_20a0 = local_20a0 * local_19c0;
        fStack_209c = fStack_209c * fStack_19bc;
        fStack_2098 = fStack_2098 * fStack_19b8;
        fStack_2094 = fStack_2094 * fStack_19b4;
        fStack_2090 = fStack_2090 * fStack_19b0;
        fStack_208c = fStack_208c * fStack_19ac;
        fStack_2088 = fStack_2088 * fStack_19a8;
        local_19e0 = CONCAT44(fStack_209c,local_20a0);
        uStack_19d8 = CONCAT44(fStack_2094,fStack_2098);
        uStack_19d0 = CONCAT44(fStack_208c,fStack_2090);
        uStack_19c8 = CONCAT44(0x3f37e013,fStack_2088);
        local_15c0 = local_19e0;
        uStack_15b8 = uStack_19d8;
        uStack_15b0 = uStack_19d0;
        uStack_15a8 = uStack_19c8;
        local_15e0 = local_1900._0_8_;
        uStack_15d8 = local_1900._8_8_;
        uStack_15d0 = local_1900._16_8_;
        uStack_15c8 = local_1900._24_8_;
        local_20a0 = local_20a0 + (float)local_1700;
        fStack_209c = fStack_209c + local_1700._4_4_;
        fStack_2098 = fStack_2098 + (float)uStack_16f8;
        fStack_2094 = fStack_2094 + uStack_16f8._4_4_;
        fStack_2090 = fStack_2090 + (float)uStack_16f0;
        fStack_208c = fStack_208c + uStack_16f0._4_4_;
        fStack_2088 = fStack_2088 + (float)uStack_16e8;
        local_19e0 = CONCAT44(fStack_209c,local_20a0);
        uStack_19d8 = CONCAT44(fStack_2094,fStack_2098);
        uStack_19d0 = CONCAT44(fStack_208c,fStack_2090);
        uStack_19c8 = CONCAT44(uStack_16e8._4_4_ + 0.71826285,fStack_2088);
        local_1600 = local_19e0;
        uStack_15f8 = uStack_19d8;
        uStack_15f0 = uStack_19d0;
        uStack_15e8 = uStack_19c8;
        local_1620 = 0x3f8000003f800000;
        uStack_1618 = 0x3f8000003f800000;
        uStack_1610 = 0x3f8000003f800000;
        uStack_1608 = 0x3f8000003f800000;
        local_20a0 = local_20a0 + 1.0;
        fStack_209c = fStack_209c + 1.0;
        fStack_2098 = fStack_2098 + 1.0;
        fStack_2094 = fStack_2094 + 1.0;
        fStack_2090 = fStack_2090 + 1.0;
        fStack_208c = fStack_208c + 1.0;
        fStack_2088 = fStack_2088 + 1.0;
        fStack_2084 = uStack_16e8._4_4_ + 0.71826285 + 1.0;
        local_19e0 = CONCAT44(fStack_209c,local_20a0);
        uStack_19d8 = CONCAT44(fStack_2094,fStack_2098);
        uStack_19d0 = CONCAT44(fStack_208c,fStack_2090);
        uStack_19c8 = CONCAT44(fStack_2084,fStack_2088);
        local_fa0 = local_1940;
        uStack_f98 = uStack_1938;
        uStack_f90 = uStack_1930;
        uStack_f88 = uStack_1928;
        local_1960 = CONCAT44((int)local_1680._4_4_,(int)(float)local_1680);
        uStack_1958 = CONCAT44((int)uStack_1678._4_4_,(int)(float)uStack_1678);
        uStack_1950 = CONCAT44((int)uStack_1670._4_4_,(int)(float)uStack_1670);
        uStack_1948 = CONCAT44((int)uStack_1668._4_4_,(int)(float)uStack_1668);
        local_e80 = local_1960;
        uStack_e78 = uStack_1958;
        uStack_e70 = uStack_1950;
        uStack_e68 = uStack_1948;
        local_ea0 = 0x7f0000007f;
        uStack_e98 = 0x7f0000007f;
        uStack_e90 = 0x7f0000007f;
        uStack_e88 = 0x7f0000007f;
        local_f20 = local_1960;
        uStack_f18 = uStack_1958;
        uStack_f10 = uStack_1950;
        uStack_f08 = uStack_1948;
        local_f40 = 0x7f0000007f;
        uStack_f38 = 0x7f0000007f;
        uStack_f30 = 0x7f0000007f;
        uStack_f28 = 0x7f0000007f;
        local_ed0 = 0x7f0000007f;
        uStack_ec8 = 0x7f0000007f;
        local_ee0 = 0x7f0000007f;
        uStack_ed8 = 0x7f0000007f;
        local_b20 = local_1960;
        uStack_b18 = uStack_1958;
        local_b30 = 0x7f0000007f;
        uStack_b28 = 0x7f0000007f;
        auVar31._8_8_ = uStack_1958;
        auVar31._0_8_ = local_1960;
        auVar30._8_8_ = 0x7f0000007f;
        auVar30._0_8_ = 0x7f0000007f;
        local_eb0 = vpaddd_avx(auVar31,auVar30);
        local_b40 = uStack_1950;
        uStack_b38 = uStack_1948;
        local_b50 = 0x7f0000007f;
        uStack_b48 = 0x7f0000007f;
        auVar29._8_8_ = uStack_1948;
        auVar29._0_8_ = uStack_1950;
        auVar28._8_8_ = 0x7f0000007f;
        auVar28._0_8_ = 0x7f0000007f;
        local_ec0 = vpaddd_avx(auVar29,auVar28);
        local_f60 = local_eb0._0_8_;
        uStack_f58 = local_eb0._8_8_;
        uStack_f50 = local_ec0._0_8_;
        uStack_f48 = local_ec0._8_8_;
        local_f00 = local_eb0._0_8_;
        uStack_ef8 = local_eb0._8_8_;
        uStack_ef0 = local_ec0._0_8_;
        uStack_ee8 = local_ec0._8_8_;
        local_cc0 = local_eb0._0_8_;
        uStack_cb8 = local_eb0._8_8_;
        uStack_cb0 = local_ec0._0_8_;
        uStack_ca8 = local_ec0._8_8_;
        local_cc4 = 0x17;
        local_d40 = local_eb0._0_8_;
        uStack_d38 = local_eb0._8_8_;
        uStack_d30 = local_ec0._0_8_;
        uStack_d28 = local_ec0._8_8_;
        local_aa0 = local_eb0._0_8_;
        uStack_a98 = local_eb0._8_8_;
        local_aa4 = 0x17;
        local_ce0 = vpslld_avx(local_eb0,ZEXT416(0x17));
        local_ac0 = local_ec0._0_8_;
        uStack_ab8 = local_ec0._8_8_;
        local_ac4 = 0x17;
        local_cf0 = vpslld_avx(local_ec0,ZEXT416(0x17));
        local_d60 = local_ce0._0_8_;
        uStack_d58 = local_ce0._8_8_;
        uStack_d50 = local_cf0._0_8_;
        uStack_d48 = local_cf0._8_8_;
        local_d20 = local_ce0._0_8_;
        uStack_d18 = local_ce0._8_8_;
        uStack_d10 = local_cf0._0_8_;
        uStack_d08 = local_cf0._8_8_;
        local_1960 = local_ce0._0_8_;
        uStack_1958 = local_ce0._8_8_;
        uStack_1950 = local_cf0._0_8_;
        uStack_1948 = local_cf0._8_8_;
        local_be0 = local_ce0._0_8_;
        uStack_bd8 = local_ce0._8_8_;
        uStack_bd0 = local_cf0._0_8_;
        uStack_bc8 = local_cf0._8_8_;
        local_1a00 = local_ce0._0_8_;
        uStack_19f8 = local_ce0._8_8_;
        uStack_19f0 = local_cf0._0_8_;
        uStack_19e8 = local_cf0._8_8_;
        local_18c0 = local_19e0;
        uStack_18b8 = uStack_19d8;
        uStack_18b0 = uStack_19d0;
        uStack_18a8 = uStack_19c8;
        local_18e0._0_4_ = local_ce0._0_4_;
        local_18e0._4_4_ = local_ce0._4_4_;
        uStack_18d8._0_4_ = local_ce0._8_4_;
        uStack_18d8._4_4_ = local_ce0._12_4_;
        uStack_18d0._0_4_ = local_cf0._0_4_;
        uStack_18d0._4_4_ = local_cf0._4_4_;
        uStack_18c8._0_4_ = local_cf0._8_4_;
        local_20a0 = local_20a0 * (float)local_18e0;
        fStack_209c = fStack_209c * local_18e0._4_4_;
        fStack_2098 = fStack_2098 * (float)uStack_18d8;
        fStack_2094 = fStack_2094 * uStack_18d8._4_4_;
        fStack_2090 = fStack_2090 * (float)uStack_18d0;
        fStack_208c = fStack_208c * uStack_18d0._4_4_;
        fStack_2088 = fStack_2088 * (float)uStack_18c8;
        local_19e0 = CONCAT44(fStack_209c,local_20a0);
        uStack_19d8 = CONCAT44(fStack_2094,fStack_2098);
        uStack_19d0 = CONCAT44(fStack_208c,fStack_2090);
        uStack_19c8 = CONCAT44(fStack_2084,fStack_2088);
        local_2020 = local_19e0;
        uStack_2018 = uStack_19d8;
        uStack_2010 = uStack_19d0;
        uStack_2008 = uStack_19c8;
        local_2000._0_4_ = local_11a0._0_4_;
        local_2000._4_4_ = local_11a0._4_4_;
        uStack_1ff8._0_4_ = local_11a0._8_4_;
        uStack_1ff8._4_4_ = local_11a0._12_4_;
        uStack_1ff0._0_4_ = auStack_1190._0_4_;
        uStack_1ff0._4_4_ = auStack_1190._4_4_;
        uStack_1fe8._0_4_ = auStack_1190._8_4_;
        uStack_1fe8._4_4_ = auStack_1190._12_4_;
        local_20a0 = (float)local_2000 + local_20a0;
        fStack_209c = local_2000._4_4_ + fStack_209c;
        fStack_2098 = (float)uStack_1ff8 + fStack_2098;
        fStack_2094 = uStack_1ff8._4_4_ + fStack_2094;
        fStack_2090 = (float)uStack_1ff0 + fStack_2090;
        fStack_208c = uStack_1ff0._4_4_ + fStack_208c;
        fStack_2088 = (float)uStack_1fe8 + fStack_2088;
        fStack_2084 = uStack_1fe8._4_4_ + fStack_2084;
        auVar17._16_8_ = auStack_1190._0_8_;
        auVar17._0_16_ = local_11a0;
        auVar17._24_8_ = auStack_1190._8_8_;
        auVar16._4_4_ = fStack_209c;
        auVar16._0_4_ = local_20a0;
        auVar16._8_4_ = fStack_2098;
        auVar16._12_4_ = fStack_2094;
        auVar16._16_4_ = fStack_2090;
        auVar16._20_4_ = fStack_208c;
        auVar16._24_4_ = fStack_2088;
        auVar16._28_4_ = fStack_2084;
        _local_2200 = vdivps_avx(auVar17,auVar16);
        local_21e0._0_4_ = (float)local_2420;
        local_21e0._4_4_ = (float)((ulong)local_2420 >> 0x20);
        uStack_21d8._0_4_ = (float)uStack_2418;
        uStack_21d8._4_4_ = (float)((ulong)uStack_2418 >> 0x20);
        uStack_21d0._0_4_ = (float)uStack_2410;
        uStack_21d0._4_4_ = (float)((ulong)uStack_2410 >> 0x20);
        uStack_21c8._0_4_ = (float)uStack_2408;
        uStack_21c8._4_4_ = (undefined4)((ulong)uStack_2408 >> 0x20);
        uStack_22e4 = uStack_21c8._4_4_;
        local_2300 = (float)local_21e0 * (float)local_2200._0_4_;
        fStack_22fc = local_21e0._4_4_ * (float)local_2200._4_4_;
        fStack_22f8 = (float)uStack_21d8 * fStack_21f8;
        fStack_22f4 = uStack_21d8._4_4_ * fStack_21f4;
        fStack_22f0 = (float)uStack_21d0 * fStack_21f0;
        fStack_22ec = uStack_21d0._4_4_ * fStack_21ec;
        fStack_22e8 = (float)uStack_21c8 * fStack_21e8;
        auVar11._4_4_ = fStack_22fc;
        auVar11._0_4_ = local_2300;
        auVar11._8_4_ = fStack_22f8;
        auVar11._12_4_ = fStack_22f4;
        auVar11._16_4_ = fStack_22f0;
        auVar11._20_4_ = fStack_22ec;
        auVar11._24_4_ = fStack_22e8;
        auVar11._28_4_ = uStack_21c8._4_4_;
        *local_2390 = auVar11;
        local_2390 = local_2390 + 1;
        local_22a0 = local_2420;
        uStack_2298 = uStack_2418;
        uStack_2290 = uStack_2410;
        uStack_2288 = uStack_2408;
        local_21e0 = local_2420;
        uStack_21d8 = uStack_2418;
        uStack_21d0 = uStack_2410;
        uStack_21c8 = uStack_2408;
        local_2160 = local_2420;
        uStack_2158 = uStack_2418;
        uStack_2150 = uStack_2410;
        uStack_2148 = uStack_2408;
        local_2000 = local_2080;
        uStack_1ff8 = uStack_2078;
        uStack_1ff0 = uStack_2070;
        uStack_1fe8 = uStack_2068;
        _local_1920 = auVar5;
        local_18e0 = local_ce0._0_8_;
        uStack_18d8 = local_ce0._8_8_;
        uStack_18d0 = local_cf0._0_8_;
        uStack_18c8 = local_cf0._8_8_;
        local_1700 = local_1720;
        uStack_16f8 = uStack_1718;
        uStack_16f0 = uStack_1710;
        uStack_16e8 = uStack_1708;
        local_1680 = local_1940;
        uStack_1678 = uStack_1938;
        uStack_1670 = uStack_1930;
        uStack_1668 = uStack_1928;
        local_1640 = uVar7;
        uStack_1638 = uVar8;
        uStack_1630 = uVar9;
        uStack_1628 = uVar10;
        local_1460 = local_15a0;
        uStack_1458 = uStack_1598;
        uStack_1450 = uStack_1590;
        uStack_1448 = uStack_1588;
        local_1260 = local_2420;
        uStack_1258 = uStack_2418;
        uStack_1250 = uStack_2410;
        uStack_1248 = uStack_2408;
        local_11c0 = local_1220;
        local_117c = local_1180;
        local_1178 = local_1180;
        local_1174 = local_1180;
        local_1170 = local_1180;
        local_116c = local_1180;
        local_1168 = local_1180;
        local_1164 = local_1180;
      }
    }
  }
  else if (local_2384 == 4) {
    local_2384 = 4;
    for (local_2424 = 0; local_2424 < local_237c; local_2424 = local_2424 + 1) {
      this_00 = &local_2478;
      ncnn::Mat::channel(in_stack_ffffffffffffdab0,(int)((ulong)this_00 >> 0x20));
      in_stack_ffffffffffffdab0 = (Mat *)ncnn::Mat::operator_cast_to_float_(this_00);
      ncnn::Mat::~Mat((Mat *)0x9036b1);
      local_2430 = in_stack_ffffffffffffdab0;
      for (local_247c = 0; local_247c < local_2380; local_247c = local_247c + 1) {
        local_2268 = local_2430;
        local_2490 = local_2430->data;
        piStack_2488 = local_2430->refcount;
        auVar53._0_8_ = local_2430->data;
        auVar53._8_8_ = local_2430->refcount;
        local_a40._0_8_ = local_2430->data;
        local_a40._8_8_ = local_2430->refcount;
        local_2228 = local_2430;
        local_9d4 = 0x3f800000;
        local_9f0 = 0x3f800000;
        local_a50 = 0x3f8000003f800000;
        uStack_a48 = 0x3f8000003f800000;
        local_9a0._8_8_ = 0x3f8000003f800000;
        local_9a0._0_8_ = 0x3f8000003f800000;
        local_1f0 = ZEXT816(0) << 0x20;
        local_200 = 0;
        local_1c0._8_8_ = SUB168(ZEXT816(0),4);
        uStack_1f8 = local_1c0._8_8_;
        auVar54._8_8_ = 0;
        auVar54._0_8_ = local_1c0._8_8_;
        auVar2 = vsubps_avx(auVar54 << 0x40,auVar53);
        local_5e0 = 0x3f8000003f800000;
        uStack_5d8 = 0x3f8000003f800000;
        local_5a0._0_8_ = auVar2._0_8_;
        local_1a0 = local_5a0._0_8_;
        local_5a0._8_8_ = auVar2._8_8_;
        uStack_198 = local_5a0._8_8_;
        local_1b0 = 0x42b0c0a542b0c0a5;
        uStack_1a8 = 0x42b0c0a542b0c0a5;
        auVar42._8_8_ = 0x42b0c0a542b0c0a5;
        auVar42._0_8_ = 0x42b0c0a542b0c0a5;
        auVar2 = vminps_avx(auVar2,auVar42);
        local_5a0._0_8_ = auVar2._0_8_;
        local_160 = local_5a0._0_8_;
        local_5a0._8_8_ = auVar2._8_8_;
        uStack_158 = local_5a0._8_8_;
        local_170 = 0xc2b0c0a5c2b0c0a5;
        uStack_168 = 0xc2b0c0a5c2b0c0a5;
        auVar44._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar44._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar3 = vmaxps_avx(auVar2,auVar44);
        local_5a0._0_8_ = auVar3._0_8_;
        uVar7 = local_5a0._0_8_;
        local_5a0._8_8_ = auVar3._8_8_;
        uVar8 = local_5a0._8_8_;
        local_410 = 0x3fb8aa3b3fb8aa3b;
        uStack_408 = 0x3fb8aa3b3fb8aa3b;
        local_400._0_4_ = auVar3._0_4_;
        local_400._4_4_ = auVar3._4_4_;
        uStack_3f8._0_4_ = auVar3._8_4_;
        uStack_3f8._4_4_ = auVar3._12_4_;
        local_5c0._4_4_ = local_400._4_4_ * 1.442695;
        local_5c0._0_4_ = (float)local_400 * 1.442695;
        uStack_5b8._0_4_ = (float)uStack_3f8 * 1.442695;
        uStack_5b8._4_4_ = uStack_3f8._4_4_ * 1.442695;
        local_300 = local_5c0;
        uStack_2f8 = uStack_5b8;
        local_3b0 = 0x3f0000003f000000;
        uStack_3a8 = 0x3f0000003f000000;
        local_5c0._0_4_ = (float)local_400 * 1.442695 + 0.5;
        local_5c0._4_4_ = local_400._4_4_ * 1.442695 + 0.5;
        fVar59 = (float)uStack_3f8 * 1.442695 + 0.5;
        fVar60 = uStack_3f8._4_4_ * 1.442695 + 0.5;
        uStack_5b8._0_4_ = fVar59;
        uStack_5b8._4_4_ = fVar60;
        local_120 = local_5c0;
        uStack_118 = uStack_5b8;
        local_5d0._4_4_ = (int)(float)local_5c0._4_4_;
        local_5d0._0_4_ = (int)(float)local_5c0._0_4_;
        local_5d0._8_4_ = (int)fVar59;
        local_5d0._12_4_ = (int)fVar60;
        local_f0 = local_5d0._0_8_;
        uStack_e8 = local_5d0._8_8_;
        auVar46._8_8_ = local_5d0._8_8_;
        auVar46._0_8_ = local_5d0._0_8_;
        auVar1 = vcvtdq2ps_avx(auVar46);
        local_5b0 = auVar1._0_8_;
        local_c0 = local_5b0;
        uStack_5a8 = auVar1._8_8_;
        uStack_b8 = uStack_5a8;
        local_d0 = local_5c0;
        uStack_c8 = uStack_5b8;
        auVar48._8_8_ = uStack_5b8;
        auVar48._0_8_ = local_5c0;
        auVar2 = vcmpps_avx(auVar48,auVar1,1);
        local_5f0._0_8_ = auVar2._0_8_;
        local_80 = local_5f0._0_8_;
        local_5f0._8_8_ = auVar2._8_8_;
        uStack_78 = local_5f0._8_8_;
        local_90 = 0x3f8000003f800000;
        uStack_88 = 0x3f8000003f800000;
        auVar50._8_8_ = 0x3f8000003f800000;
        auVar50._0_8_ = 0x3f8000003f800000;
        local_5f0 = vpand_avx(auVar2,auVar50);
        local_2a0 = local_5b0;
        uStack_298 = uStack_5a8;
        local_2b0 = local_5f0._0_8_;
        uStack_2a8 = local_5f0._8_8_;
        _local_5c0 = vsubps_avx(auVar1,local_5f0);
        local_430 = 0x3f3180003f318000;
        uStack_428 = 0x3f3180003f318000;
        local_420._0_4_ = local_5c0._0_4_;
        local_420._4_4_ = local_5c0._4_4_;
        uStack_418._0_4_ = local_5c0._8_4_;
        uStack_418._4_4_ = local_5c0._12_4_;
        local_5b0 = CONCAT44(local_420._4_4_ * 0.6933594,(float)local_420 * 0.6933594);
        uStack_5a8._0_4_ = (float)uStack_418 * 0.6933594;
        uStack_5a8._4_4_ = uStack_418._4_4_ * 0.6933594;
        local_440 = local_5c0;
        uStack_438 = uStack_5b8;
        local_450 = 0xb95e8083b95e8083;
        uStack_448 = 0xb95e8083b95e8083;
        local_2c0 = local_5a0._0_8_;
        uStack_2b8 = local_5a0._8_8_;
        local_2d0 = local_5b0;
        uStack_2c8 = uStack_5a8;
        auVar39._8_8_ = uStack_5a8;
        auVar39._0_8_ = local_5b0;
        auVar2 = vsubps_avx(auVar3,auVar39);
        local_5a0._0_8_ = auVar2._0_8_;
        local_2e0 = local_5a0._0_8_;
        local_5a0._8_8_ = auVar2._8_8_;
        uStack_2d8 = local_5a0._8_8_;
        local_2f0 = CONCAT44(local_420._4_4_ * -0.00021219444,(float)local_420 * -0.00021219444);
        uStack_2e8 = CONCAT44(uStack_418._4_4_ * -0.00021219444,(float)uStack_418 * -0.00021219444);
        auVar38._8_8_ = uStack_2e8;
        auVar38._0_8_ = local_2f0;
        local_5a0 = vsubps_avx(auVar2,auVar38);
        local_470 = local_5a0._0_8_;
        uStack_468 = local_5a0._8_8_;
        local_460._0_4_ = local_5a0._0_4_;
        local_460._4_4_ = local_5a0._4_4_;
        uStack_458._0_4_ = local_5a0._8_4_;
        uStack_458._4_4_ = local_5a0._12_4_;
        local_600 = (float)local_460 * (float)local_460;
        fStack_5fc = local_460._4_4_ * local_460._4_4_;
        fStack_5f8 = (float)uStack_458 * (float)uStack_458;
        fStack_5f4 = uStack_458._4_4_ * uStack_458._4_4_;
        local_480 = 0x3950696739506967;
        uStack_478 = 0x3950696739506967;
        local_490 = local_5a0._0_8_;
        uStack_488 = local_5a0._8_8_;
        local_320 = CONCAT44(local_460._4_4_ * 0.00019875691,(float)local_460 * 0.00019875691);
        uStack_318 = CONCAT44(uStack_458._4_4_ * 0.00019875691,(float)uStack_458 * 0.00019875691);
        local_330 = 0x3ab743ce3ab743ce;
        uStack_328 = 0x3ab743ce3ab743ce;
        local_610 = (float)local_460 * 0.00019875691 + 0.0013981999;
        fStack_60c = local_460._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_608 = (float)uStack_458 * 0.00019875691 + 0.0013981999;
        fStack_604 = uStack_458._4_4_ * 0.00019875691 + 0.0013981999;
        local_4a0 = CONCAT44(fStack_60c,local_610);
        uStack_498 = CONCAT44(fStack_604,fStack_608);
        local_4b0 = local_5a0._0_8_;
        uStack_4a8 = local_5a0._8_8_;
        local_610 = local_610 * (float)local_460;
        fStack_60c = fStack_60c * local_460._4_4_;
        fStack_608 = fStack_608 * (float)uStack_458;
        fStack_604 = fStack_604 * uStack_458._4_4_;
        local_340 = CONCAT44(fStack_60c,local_610);
        uStack_338 = CONCAT44(fStack_604,fStack_608);
        local_350 = 0x3c0889083c088908;
        uStack_348 = 0x3c0889083c088908;
        local_610 = local_610 + 0.008333452;
        fStack_60c = fStack_60c + 0.008333452;
        fStack_608 = fStack_608 + 0.008333452;
        fStack_604 = fStack_604 + 0.008333452;
        local_4c0 = CONCAT44(fStack_60c,local_610);
        uStack_4b8 = CONCAT44(fStack_604,fStack_608);
        local_4d0 = local_5a0._0_8_;
        uStack_4c8 = local_5a0._8_8_;
        local_610 = local_610 * (float)local_460;
        fStack_60c = fStack_60c * local_460._4_4_;
        fStack_608 = fStack_608 * (float)uStack_458;
        fStack_604 = fStack_604 * uStack_458._4_4_;
        local_360 = CONCAT44(fStack_60c,local_610);
        uStack_358 = CONCAT44(fStack_604,fStack_608);
        local_370 = 0x3d2aa9c13d2aa9c1;
        uStack_368 = 0x3d2aa9c13d2aa9c1;
        local_610 = local_610 + 0.041665796;
        fStack_60c = fStack_60c + 0.041665796;
        fStack_608 = fStack_608 + 0.041665796;
        fStack_604 = fStack_604 + 0.041665796;
        local_4e0 = CONCAT44(fStack_60c,local_610);
        uStack_4d8 = CONCAT44(fStack_604,fStack_608);
        local_4f0 = local_5a0._0_8_;
        uStack_4e8 = local_5a0._8_8_;
        local_610 = local_610 * (float)local_460;
        fStack_60c = fStack_60c * local_460._4_4_;
        fStack_608 = fStack_608 * (float)uStack_458;
        fStack_604 = fStack_604 * uStack_458._4_4_;
        local_380 = CONCAT44(fStack_60c,local_610);
        uStack_378 = CONCAT44(fStack_604,fStack_608);
        local_390 = 0x3e2aaaaa3e2aaaaa;
        uStack_388 = 0x3e2aaaaa3e2aaaaa;
        local_610 = local_610 + 0.16666666;
        fStack_60c = fStack_60c + 0.16666666;
        fStack_608 = fStack_608 + 0.16666666;
        fStack_604 = fStack_604 + 0.16666666;
        local_500 = CONCAT44(fStack_60c,local_610);
        uStack_4f8 = CONCAT44(fStack_604,fStack_608);
        local_510 = local_5a0._0_8_;
        uStack_508 = local_5a0._8_8_;
        local_610 = local_610 * (float)local_460;
        fStack_60c = fStack_60c * local_460._4_4_;
        fStack_608 = fStack_608 * (float)uStack_458;
        fStack_604 = fStack_604 * uStack_458._4_4_;
        local_3a0 = CONCAT44(fStack_60c,local_610);
        uStack_398 = CONCAT44(fStack_604,fStack_608);
        local_610 = local_610 + 0.5;
        fStack_60c = fStack_60c + 0.5;
        fStack_608 = fStack_608 + 0.5;
        fStack_604 = fStack_604 + 0.5;
        local_520 = CONCAT44(fStack_60c,local_610);
        uStack_518 = CONCAT44(fStack_604,fStack_608);
        local_530 = CONCAT44(fStack_5fc,local_600);
        uStack_528 = CONCAT44(fStack_5f4,fStack_5f8);
        local_610 = local_610 * local_600;
        fStack_60c = fStack_60c * fStack_5fc;
        fStack_608 = fStack_608 * fStack_5f8;
        fStack_604 = fStack_604 * fStack_5f4;
        local_3c0 = CONCAT44(fStack_60c,local_610);
        uStack_3b8 = CONCAT44(fStack_604,fStack_608);
        local_3d0 = local_5a0._0_8_;
        uStack_3c8 = local_5a0._8_8_;
        local_610 = local_610 + (float)local_460;
        fStack_60c = fStack_60c + local_460._4_4_;
        fStack_608 = fStack_608 + (float)uStack_458;
        fStack_604 = fStack_604 + uStack_458._4_4_;
        local_3e0 = CONCAT44(fStack_60c,local_610);
        uStack_3d8 = CONCAT44(fStack_604,fStack_608);
        local_3f0 = 0x3f8000003f800000;
        uStack_3e8 = 0x3f8000003f800000;
        local_610 = local_610 + 1.0;
        fStack_60c = fStack_60c + 1.0;
        fStack_608 = fStack_608 + 1.0;
        fStack_604 = fStack_604 + 1.0;
        local_130 = local_5c0;
        uStack_128 = uStack_5b8;
        local_5d0._4_4_ = (int)local_420._4_4_;
        local_5d0._0_4_ = (int)(float)local_420;
        local_5d0._8_4_ = (int)(float)uStack_418;
        local_5d0._12_4_ = (int)uStack_418._4_4_;
        local_580 = local_5d0._0_8_;
        uStack_578 = local_5d0._8_8_;
        local_590 = 0x7f0000007f;
        uStack_588 = 0x7f0000007f;
        auVar37._8_8_ = local_5d0._8_8_;
        auVar37._0_8_ = local_5d0._0_8_;
        auVar36._8_8_ = 0x7f0000007f;
        auVar36._0_8_ = 0x7f0000007f;
        auVar2 = vpaddd_avx(auVar37,auVar36);
        local_5d0._0_8_ = auVar2._0_8_;
        local_560 = local_5d0._0_8_;
        local_5d0._8_8_ = auVar2._8_8_;
        uStack_558 = local_5d0._8_8_;
        local_564 = 0x17;
        local_5d0 = vpslld_avx(auVar2,ZEXT416(0x17));
        local_50 = local_5d0._0_8_;
        uStack_48 = local_5d0._8_8_;
        local_620 = local_5d0._0_8_;
        uStack_618 = local_5d0._8_8_;
        local_540._4_4_ = fStack_60c;
        local_540._0_4_ = local_610;
        local_540._8_4_ = fStack_608;
        local_540._12_4_ = fStack_604;
        local_550._0_4_ = local_5d0._0_4_;
        local_550._4_4_ = local_5d0._4_4_;
        uStack_548._0_4_ = local_5d0._8_4_;
        uStack_548._4_4_ = local_5d0._12_4_;
        local_610 = local_610 * (float)local_550;
        fStack_60c = fStack_60c * local_550._4_4_;
        fStack_608 = fStack_608 * (float)uStack_548;
        fStack_604 = fStack_604 * uStack_548._4_4_;
        local_970 = CONCAT44(fStack_60c,local_610);
        uStack_968 = CONCAT44(fStack_604,fStack_608);
        local_9b0 = local_610 + 1.0;
        fStack_9ac = fStack_60c + 1.0;
        fStack_9a8 = fStack_608 + 1.0;
        fStack_9a4 = fStack_604 + 1.0;
        auVar33._4_4_ = fStack_9ac;
        auVar33._0_4_ = local_9b0;
        auVar33._8_4_ = fStack_9a8;
        auVar33._12_4_ = fStack_9a4;
        _local_a90 = vdivps_avx(local_9a0,auVar33);
        local_a80._0_4_ = SUB84(local_2490,0);
        local_a80._4_4_ = (undefined4)((ulong)local_2490 >> 0x20);
        fStack_a78 = SUB84(piStack_2488,0);
        fStack_a74 = (float)((ulong)piStack_2488 >> 0x20);
        local_2240 = (float)local_a80._0_4_ * (float)local_a90._0_4_;
        fStack_223c = (float)local_a80._4_4_ * (float)local_a90._4_4_;
        fStack_2238 = fStack_a78 * fStack_a88;
        fStack_2234 = fStack_a74 * fStack_a84;
        uVar15 = fStack_223c;
        uVar13 = local_2240;
        auVar14._0_8_ = CONCAT44(uVar15,uVar13);
        auVar14._8_4_ = fStack_2238;
        auVar14._12_4_ = fStack_2234;
        local_2268->data = (void *)auVar14._0_8_;
        local_2268->refcount = (int *)auVar14._8_8_;
        local_2430 = (Mat *)&local_2430->elemsize;
        local_2210 = local_2490;
        piStack_2208 = piStack_2488;
        _local_a80 = local_a40;
        uStack_9ec = local_9f0;
        uStack_9e8 = local_9f0;
        uStack_9e4 = local_9f0;
        local_960 = local_9a0;
        local_550 = local_5d0._0_8_;
        uStack_548 = local_5d0._8_8_;
        local_460 = local_470;
        uStack_458 = uStack_468;
        local_420 = local_5c0;
        uStack_418 = uStack_5b8;
        local_400 = uVar7;
        uStack_3f8 = uVar8;
        local_310 = local_3b0;
        uStack_308 = uStack_3a8;
        local_210 = local_2490;
        piStack_208 = piStack_2488;
        local_1c0 = local_1f0;
      }
    }
  }
  else {
    for (local_2494 = 0; local_2494 < local_237c; local_2494 = local_2494 + 1) {
      ncnn::Mat::channel(in_stack_ffffffffffffdab0,(int)((ulong)in_stack_ffffffffffffdaa8 >> 0x20));
      pauVar57 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_24e8);
      ncnn::Mat::~Mat((Mat *)0x90412b);
      local_24a0 = pauVar57;
      for (local_24ec = 0; local_24ec + 7 < local_2380; local_24ec = local_24ec + 8) {
        local_2350 = local_24a0;
        local_22c0 = *(undefined8 *)*local_24a0;
        uStack_22b8 = *(undefined8 *)(*local_24a0 + 8);
        uStack_22b0 = *(undefined8 *)(*local_24a0 + 0x10);
        auVar52 = *(undefined1 (*) [24])*local_24a0;
        uStack_22a8 = *(undefined8 *)(*local_24a0 + 0x18);
        auVar11 = *local_24a0;
        local_2308 = local_24a0;
        local_20e8 = 0x3f800000;
        local_1140 = 0x3f800000;
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        local_1160 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        auStack_1150 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        local_2140 = local_1160._0_8_;
        uStack_2138 = local_1160._8_8_;
        uStack_2130 = auStack_1150._0_8_;
        uStack_2128 = auStack_1150._8_8_;
        local_20c0._16_8_ = auStack_1150._0_8_;
        local_20c0._0_16_ = local_1160;
        local_20c0._24_8_ = auStack_1150._8_8_;
        local_1200 = ZEXT832(0) << 0x20;
        local_1280 = 0;
        local_11e0._8_8_ = SUB328(ZEXT832(0),4);
        uStack_1278 = local_11e0._8_8_;
        uStack_1270 = 0;
        uStack_1268 = 0;
        local_2120._0_8_ = auVar52._0_8_;
        local_12a0 = local_2120._0_8_;
        local_2120._8_8_ = auVar52._8_8_;
        uStack_1298 = local_2120._8_8_;
        local_2120._16_8_ = auVar52._16_8_;
        uStack_1290 = local_2120._16_8_;
        auVar6 = vsubps_avx(ZEXT832((ulong)local_11e0._8_8_) << 0x40,*local_24a0);
        local_1f60 = 0x3f8000003f800000;
        uStack_1f58 = 0x3f8000003f800000;
        uStack_1f50 = 0x3f8000003f800000;
        uStack_1f48 = 0x3f8000003f800000;
        local_1ee0._0_8_ = auVar6._0_8_;
        local_10c0 = local_1ee0._0_8_;
        local_1ee0._8_8_ = auVar6._8_8_;
        uStack_10b8 = local_1ee0._8_8_;
        local_1ee0._16_8_ = auVar6._16_8_;
        uStack_10b0 = local_1ee0._16_8_;
        local_1ee0._24_8_ = auVar6._24_8_;
        uStack_10a8 = local_1ee0._24_8_;
        local_10e0 = 0x42b0c0a542b0c0a5;
        uStack_10d8 = 0x42b0c0a542b0c0a5;
        uStack_10d0 = 0x42b0c0a542b0c0a5;
        uStack_10c8 = 0x42b0c0a542b0c0a5;
        auVar22._8_8_ = 0x42b0c0a542b0c0a5;
        auVar22._0_8_ = 0x42b0c0a542b0c0a5;
        auVar22._16_8_ = 0x42b0c0a542b0c0a5;
        auVar22._24_8_ = 0x42b0c0a542b0c0a5;
        auVar6 = vminps_avx(auVar6,auVar22);
        local_1ee0._0_8_ = auVar6._0_8_;
        local_1040 = local_1ee0._0_8_;
        local_1ee0._8_8_ = auVar6._8_8_;
        uStack_1038 = local_1ee0._8_8_;
        local_1ee0._16_8_ = auVar6._16_8_;
        uStack_1030 = local_1ee0._16_8_;
        local_1ee0._24_8_ = auVar6._24_8_;
        uStack_1028 = local_1ee0._24_8_;
        local_1060 = 0xc2b0c0a5c2b0c0a5;
        uStack_1058 = 0xc2b0c0a5c2b0c0a5;
        uStack_1050 = 0xc2b0c0a5c2b0c0a5;
        uStack_1048 = 0xc2b0c0a5c2b0c0a5;
        auVar24._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar24._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar24._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar24._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar4 = vmaxps_avx(auVar6,auVar24);
        local_1ee0._0_8_ = auVar4._0_8_;
        uVar7 = local_1ee0._0_8_;
        local_1ee0._8_8_ = auVar4._8_8_;
        uVar8 = local_1ee0._8_8_;
        local_1ee0._16_8_ = auVar4._16_8_;
        uVar9 = local_1ee0._16_8_;
        local_1ee0._24_8_ = auVar4._24_8_;
        uVar10 = local_1ee0._24_8_;
        local_1c40 = 0x3fb8aa3b3fb8aa3b;
        uStack_1c38 = 0x3fb8aa3b3fb8aa3b;
        uStack_1c30 = 0x3fb8aa3b3fb8aa3b;
        uStack_1c28 = 0x3fb8aa3b3fb8aa3b;
        local_1c20._0_4_ = auVar4._0_4_;
        local_1c20._4_4_ = auVar4._4_4_;
        uStack_1c18._0_4_ = auVar4._8_4_;
        uStack_1c18._4_4_ = auVar4._12_4_;
        uStack_1c10._0_4_ = auVar4._16_4_;
        uStack_1c10._4_4_ = auVar4._20_4_;
        uStack_1c08._0_4_ = auVar4._24_4_;
        uStack_1c08._4_4_ = auVar4._28_4_;
        local_1f20._4_4_ = local_1c20._4_4_ * 1.442695;
        local_1f20._0_4_ = (float)local_1c20 * 1.442695;
        uStack_1f18._0_4_ = (float)uStack_1c18 * 1.442695;
        uStack_1f18._4_4_ = uStack_1c18._4_4_ * 1.442695;
        uStack_1f10._0_4_ = (float)uStack_1c10 * 1.442695;
        uStack_1f10._4_4_ = uStack_1c10._4_4_ * 1.442695;
        auVar56 = _local_1f20;
        uStack_1f08._0_4_ = (float)uStack_1c08 * 1.442695;
        uStack_1f08._4_4_ = uStack_1c08._4_4_;
        auVar6 = _local_1f20;
        local_1a20 = local_1f20;
        uStack_1a18 = uStack_1f18;
        uStack_1f10 = auVar56._16_8_;
        uStack_1a10 = uStack_1f10;
        uStack_1f08 = auVar6._24_8_;
        uStack_1a08 = uStack_1f08;
        local_1b80 = 0x3f0000003f000000;
        uStack_1b78 = 0x3f0000003f000000;
        uStack_1b70 = 0x3f0000003f000000;
        uStack_1b68 = 0x3f0000003f000000;
        local_1f20._4_4_ = local_1c20._4_4_ * 1.442695 + 0.5;
        local_1f20._0_4_ = (float)local_1c20 * 1.442695 + 0.5;
        uStack_1f18._0_4_ = (float)uStack_1c18 * 1.442695 + 0.5;
        uStack_1f18._4_4_ = uStack_1c18._4_4_ * 1.442695 + 0.5;
        uStack_1f10._0_4_ = (float)uStack_1c10 * 1.442695 + 0.5;
        uStack_1f10._4_4_ = uStack_1c10._4_4_ * 1.442695 + 0.5;
        uStack_1f08._0_4_ = (float)uStack_1c08 * 1.442695 + 0.5;
        uStack_1f08._4_4_ = uStack_1c08._4_4_ + 0.5;
        auVar5 = vroundps_avx(_local_1f20,1);
        auVar6 = vcmpps_avx(_local_1f20,auVar5,1);
        local_1f80._0_8_ = auVar6._0_8_;
        local_fc0 = local_1f80._0_8_;
        local_1f80._8_8_ = auVar6._8_8_;
        uStack_fb8 = local_1f80._8_8_;
        local_1f80._16_8_ = auVar6._16_8_;
        uStack_fb0 = local_1f80._16_8_;
        local_1f80._24_8_ = auVar6._24_8_;
        uStack_fa8 = local_1f80._24_8_;
        local_fe0 = 0x3f8000003f800000;
        uStack_fd8 = 0x3f8000003f800000;
        uStack_fd0 = 0x3f8000003f800000;
        uStack_fc8 = 0x3f8000003f800000;
        auVar26._8_8_ = 0x3f8000003f800000;
        auVar26._0_8_ = 0x3f8000003f800000;
        auVar26._16_8_ = 0x3f8000003f800000;
        auVar26._24_8_ = 0x3f8000003f800000;
        local_1f80 = vandps_avx(auVar6,auVar26);
        local_1f00 = auVar5._0_8_;
        local_12c0 = local_1f00;
        uStack_1ef8 = auVar5._8_8_;
        uStack_12b8 = uStack_1ef8;
        uStack_1ef0 = auVar5._16_8_;
        uStack_12b0 = uStack_1ef0;
        uStack_1ee8 = auVar5._24_8_;
        uStack_12a8 = uStack_1ee8;
        local_12e0 = local_1f80._0_8_;
        uStack_12d8 = local_1f80._8_8_;
        uStack_12d0 = local_1f80._16_8_;
        uStack_12c8 = local_1f80._24_8_;
        _local_1f20 = vsubps_avx(auVar5,local_1f80);
        local_1c80 = 0x3f3180003f318000;
        uStack_1c78 = 0x3f3180003f318000;
        uStack_1c70 = 0x3f3180003f318000;
        uStack_1c68 = 0x3f3180003f318000;
        local_1c60._0_4_ = local_1f20._0_4_;
        local_1c60._4_4_ = local_1f20._4_4_;
        uStack_1c58._0_4_ = local_1f20._8_4_;
        uStack_1c58._4_4_ = local_1f20._12_4_;
        uStack_1c50._0_4_ = local_1f20._16_4_;
        uStack_1c50._4_4_ = local_1f20._20_4_;
        uStack_1c48._0_4_ = local_1f20._24_4_;
        uStack_1c48._4_4_ = local_1f20._28_4_;
        local_1f00._4_4_ = local_1c60._4_4_ * 0.6933594;
        local_1f00._0_4_ = (float)local_1c60 * 0.6933594;
        uStack_1ef8._0_4_ = (float)uStack_1c58 * 0.6933594;
        uStack_1ef8._4_4_ = uStack_1c58._4_4_ * 0.6933594;
        uStack_1ef0._0_4_ = (float)uStack_1c50 * 0.6933594;
        uStack_1ef0._4_4_ = uStack_1c50._4_4_ * 0.6933594;
        auVar56 = _local_1f00;
        uStack_1ee8._0_4_ = (float)uStack_1c48 * 0.6933594;
        uStack_1ee8._4_4_ = uStack_1c48._4_4_;
        auVar22 = _local_1f00;
        local_1ca0 = local_1f20;
        uStack_1c98 = uStack_1f18;
        uStack_1c90 = uStack_1f10;
        uStack_1c88 = uStack_1f08;
        local_1cc0 = 0xb95e8083b95e8083;
        uStack_1cb8 = 0xb95e8083b95e8083;
        uStack_1cb0 = 0xb95e8083b95e8083;
        uStack_1ca8 = 0xb95e8083b95e8083;
        local_1300 = local_1ee0._0_8_;
        uStack_12f8 = local_1ee0._8_8_;
        uStack_12f0 = local_1ee0._16_8_;
        uStack_12e8 = local_1ee0._24_8_;
        local_1320 = local_1f00;
        uStack_1318 = uStack_1ef8;
        uStack_1ef0 = auVar56._16_8_;
        uStack_1310 = uStack_1ef0;
        uStack_1ee8 = auVar22._24_8_;
        uStack_1308 = uStack_1ee8;
        auVar20._16_8_ = uStack_1ef0;
        auVar20._0_16_ = _local_1f00;
        auVar20._24_8_ = uStack_1ee8;
        auVar6 = vsubps_avx(auVar4,auVar20);
        local_1ee0._0_8_ = auVar6._0_8_;
        local_1340 = local_1ee0._0_8_;
        local_1ee0._8_8_ = auVar6._8_8_;
        uStack_1338 = local_1ee0._8_8_;
        local_1ee0._16_8_ = auVar6._16_8_;
        uStack_1330 = local_1ee0._16_8_;
        local_1ee0._24_8_ = auVar6._24_8_;
        uStack_1328 = local_1ee0._24_8_;
        local_1360 = CONCAT44(local_1c60._4_4_ * -0.00021219444,(float)local_1c60 * -0.00021219444);
        uStack_1358 = CONCAT44(uStack_1c58._4_4_ * -0.00021219444,
                               (float)uStack_1c58 * -0.00021219444);
        uStack_1350 = CONCAT44(uStack_1c50._4_4_ * -0.00021219444,
                               (float)uStack_1c50 * -0.00021219444);
        uStack_1348 = CONCAT44(uStack_1c48._4_4_,(float)uStack_1c48 * -0.00021219444);
        auVar5._8_8_ = uStack_1358;
        auVar5._0_8_ = local_1360;
        auVar5._16_8_ = uStack_1350;
        auVar5._24_8_ = uStack_1348;
        local_1ee0 = vsubps_avx(auVar6,auVar5);
        local_1d00 = local_1ee0._0_8_;
        uStack_1cf8 = local_1ee0._8_8_;
        uStack_1cf0 = local_1ee0._16_8_;
        uStack_1ce8 = local_1ee0._24_8_;
        local_1ce0._0_4_ = local_1ee0._0_4_;
        local_1ce0._4_4_ = local_1ee0._4_4_;
        uStack_1cd8._0_4_ = local_1ee0._8_4_;
        uStack_1cd8._4_4_ = local_1ee0._12_4_;
        uStack_1cd0._0_4_ = local_1ee0._16_4_;
        uStack_1cd0._4_4_ = local_1ee0._20_4_;
        uStack_1cc8._0_4_ = local_1ee0._24_4_;
        uStack_1cc8._4_4_ = local_1ee0._28_4_;
        fStack_1f84 = uStack_1cc8._4_4_;
        local_1fa0 = (float)local_1ce0 * (float)local_1ce0;
        fStack_1f9c = local_1ce0._4_4_ * local_1ce0._4_4_;
        fStack_1f98 = (float)uStack_1cd8 * (float)uStack_1cd8;
        fStack_1f94 = uStack_1cd8._4_4_ * uStack_1cd8._4_4_;
        fStack_1f90 = (float)uStack_1cd0 * (float)uStack_1cd0;
        fStack_1f8c = uStack_1cd0._4_4_ * uStack_1cd0._4_4_;
        fStack_1f88 = (float)uStack_1cc8 * (float)uStack_1cc8;
        local_1d20 = 0x3950696739506967;
        uStack_1d18 = 0x3950696739506967;
        uStack_1d10 = 0x3950696739506967;
        uStack_1d08 = 0x3950696739506967;
        local_1d40 = local_1ee0._0_8_;
        uStack_1d38 = local_1ee0._8_8_;
        uStack_1d30 = local_1ee0._16_8_;
        uStack_1d28 = local_1ee0._24_8_;
        local_1a60 = CONCAT44(local_1ce0._4_4_ * 0.00019875691,(float)local_1ce0 * 0.00019875691);
        uStack_1a58 = CONCAT44(uStack_1cd8._4_4_ * 0.00019875691,(float)uStack_1cd8 * 0.00019875691)
        ;
        uStack_1a50 = CONCAT44(uStack_1cd0._4_4_ * 0.00019875691,(float)uStack_1cd0 * 0.00019875691)
        ;
        uStack_1a48 = CONCAT44(0x39506967,(float)uStack_1cc8 * 0.00019875691);
        local_1a80 = 0x3ab743ce3ab743ce;
        uStack_1a78 = 0x3ab743ce3ab743ce;
        uStack_1a70 = 0x3ab743ce3ab743ce;
        uStack_1a68 = 0x3ab743ce3ab743ce;
        local_1fc0 = (float)local_1ce0 * 0.00019875691 + 0.0013981999;
        fStack_1fbc = local_1ce0._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_1fb8 = (float)uStack_1cd8 * 0.00019875691 + 0.0013981999;
        fStack_1fb4 = uStack_1cd8._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_1fb0 = (float)uStack_1cd0 * 0.00019875691 + 0.0013981999;
        fStack_1fac = uStack_1cd0._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_1fa8 = (float)uStack_1cc8 * 0.00019875691 + 0.0013981999;
        local_1d60 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_1d58 = CONCAT44(fStack_1fb4,fStack_1fb8);
        uStack_1d50 = CONCAT44(fStack_1fac,fStack_1fb0);
        uStack_1d48 = CONCAT44(0x3ad150fb,fStack_1fa8);
        local_1d80 = local_1ee0._0_8_;
        uStack_1d78 = local_1ee0._8_8_;
        uStack_1d70 = local_1ee0._16_8_;
        uStack_1d68 = local_1ee0._24_8_;
        local_1fc0 = local_1fc0 * (float)local_1ce0;
        fStack_1fbc = fStack_1fbc * local_1ce0._4_4_;
        fStack_1fb8 = fStack_1fb8 * (float)uStack_1cd8;
        fStack_1fb4 = fStack_1fb4 * uStack_1cd8._4_4_;
        fStack_1fb0 = fStack_1fb0 * (float)uStack_1cd0;
        fStack_1fac = fStack_1fac * uStack_1cd0._4_4_;
        fStack_1fa8 = fStack_1fa8 * (float)uStack_1cc8;
        local_1aa0 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_1a98 = CONCAT44(fStack_1fb4,fStack_1fb8);
        uStack_1a90 = CONCAT44(fStack_1fac,fStack_1fb0);
        uStack_1a88 = CONCAT44(0x3ad150fb,fStack_1fa8);
        local_1ac0 = 0x3c0889083c088908;
        uStack_1ab8 = 0x3c0889083c088908;
        uStack_1ab0 = 0x3c0889083c088908;
        uStack_1aa8 = 0x3c0889083c088908;
        local_1fc0 = local_1fc0 + 0.008333452;
        fStack_1fbc = fStack_1fbc + 0.008333452;
        fStack_1fb8 = fStack_1fb8 + 0.008333452;
        fStack_1fb4 = fStack_1fb4 + 0.008333452;
        fStack_1fb0 = fStack_1fb0 + 0.008333452;
        fStack_1fac = fStack_1fac + 0.008333452;
        fStack_1fa8 = fStack_1fa8 + 0.008333452;
        local_1da0 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_1d98 = CONCAT44(fStack_1fb4,fStack_1fb8);
        uStack_1d90 = CONCAT44(fStack_1fac,fStack_1fb0);
        uStack_1d88 = CONCAT44(0x3c22b327,fStack_1fa8);
        local_1dc0 = local_1ee0._0_8_;
        uStack_1db8 = local_1ee0._8_8_;
        uStack_1db0 = local_1ee0._16_8_;
        uStack_1da8 = local_1ee0._24_8_;
        local_1fc0 = local_1fc0 * (float)local_1ce0;
        fStack_1fbc = fStack_1fbc * local_1ce0._4_4_;
        fStack_1fb8 = fStack_1fb8 * (float)uStack_1cd8;
        fStack_1fb4 = fStack_1fb4 * uStack_1cd8._4_4_;
        fStack_1fb0 = fStack_1fb0 * (float)uStack_1cd0;
        fStack_1fac = fStack_1fac * uStack_1cd0._4_4_;
        fStack_1fa8 = fStack_1fa8 * (float)uStack_1cc8;
        local_1ae0 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_1ad8 = CONCAT44(fStack_1fb4,fStack_1fb8);
        uStack_1ad0 = CONCAT44(fStack_1fac,fStack_1fb0);
        uStack_1ac8 = CONCAT44(0x3c22b327,fStack_1fa8);
        local_1b00 = 0x3d2aa9c13d2aa9c1;
        uStack_1af8 = 0x3d2aa9c13d2aa9c1;
        uStack_1af0 = 0x3d2aa9c13d2aa9c1;
        uStack_1ae8 = 0x3d2aa9c13d2aa9c1;
        local_1fc0 = local_1fc0 + 0.041665796;
        fStack_1fbc = fStack_1fbc + 0.041665796;
        fStack_1fb8 = fStack_1fb8 + 0.041665796;
        fStack_1fb4 = fStack_1fb4 + 0.041665796;
        fStack_1fb0 = fStack_1fb0 + 0.041665796;
        fStack_1fac = fStack_1fac + 0.041665796;
        fStack_1fa8 = fStack_1fa8 + 0.041665796;
        local_1de0 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_1dd8 = CONCAT44(fStack_1fb4,fStack_1fb8);
        uStack_1dd0 = CONCAT44(fStack_1fac,fStack_1fb0);
        uStack_1dc8 = CONCAT44(0x3d53568b,fStack_1fa8);
        local_1e00 = local_1ee0._0_8_;
        uStack_1df8 = local_1ee0._8_8_;
        uStack_1df0 = local_1ee0._16_8_;
        uStack_1de8 = local_1ee0._24_8_;
        local_1fc0 = local_1fc0 * (float)local_1ce0;
        fStack_1fbc = fStack_1fbc * local_1ce0._4_4_;
        fStack_1fb8 = fStack_1fb8 * (float)uStack_1cd8;
        fStack_1fb4 = fStack_1fb4 * uStack_1cd8._4_4_;
        fStack_1fb0 = fStack_1fb0 * (float)uStack_1cd0;
        fStack_1fac = fStack_1fac * uStack_1cd0._4_4_;
        fStack_1fa8 = fStack_1fa8 * (float)uStack_1cc8;
        local_1b20 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_1b18 = CONCAT44(fStack_1fb4,fStack_1fb8);
        uStack_1b10 = CONCAT44(fStack_1fac,fStack_1fb0);
        uStack_1b08 = CONCAT44(0x3d53568b,fStack_1fa8);
        local_1b40 = 0x3e2aaaaa3e2aaaaa;
        uStack_1b38 = 0x3e2aaaaa3e2aaaaa;
        uStack_1b30 = 0x3e2aaaaa3e2aaaaa;
        uStack_1b28 = 0x3e2aaaaa3e2aaaaa;
        local_1fc0 = local_1fc0 + 0.16666666;
        fStack_1fbc = fStack_1fbc + 0.16666666;
        fStack_1fb8 = fStack_1fb8 + 0.16666666;
        fStack_1fb4 = fStack_1fb4 + 0.16666666;
        fStack_1fb0 = fStack_1fb0 + 0.16666666;
        fStack_1fac = fStack_1fac + 0.16666666;
        fStack_1fa8 = fStack_1fa8 + 0.16666666;
        local_1e20 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_1e18 = CONCAT44(fStack_1fb4,fStack_1fb8);
        uStack_1e10 = CONCAT44(fStack_1fac,fStack_1fb0);
        uStack_1e08 = CONCAT44(0x3e5f804d,fStack_1fa8);
        local_1e40 = local_1ee0._0_8_;
        uStack_1e38 = local_1ee0._8_8_;
        uStack_1e30 = local_1ee0._16_8_;
        uStack_1e28 = local_1ee0._24_8_;
        local_1fc0 = local_1fc0 * (float)local_1ce0;
        fStack_1fbc = fStack_1fbc * local_1ce0._4_4_;
        fStack_1fb8 = fStack_1fb8 * (float)uStack_1cd8;
        fStack_1fb4 = fStack_1fb4 * uStack_1cd8._4_4_;
        fStack_1fb0 = fStack_1fb0 * (float)uStack_1cd0;
        fStack_1fac = fStack_1fac * uStack_1cd0._4_4_;
        fStack_1fa8 = fStack_1fa8 * (float)uStack_1cc8;
        local_1b60 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_1b58 = CONCAT44(fStack_1fb4,fStack_1fb8);
        uStack_1b50 = CONCAT44(fStack_1fac,fStack_1fb0);
        uStack_1b48 = CONCAT44(0x3e5f804d,fStack_1fa8);
        local_1fc0 = local_1fc0 + 0.5;
        fStack_1fbc = fStack_1fbc + 0.5;
        fStack_1fb8 = fStack_1fb8 + 0.5;
        fStack_1fb4 = fStack_1fb4 + 0.5;
        fStack_1fb0 = fStack_1fb0 + 0.5;
        fStack_1fac = fStack_1fac + 0.5;
        fStack_1fa8 = fStack_1fa8 + 0.5;
        local_1e60 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_1e58 = CONCAT44(fStack_1fb4,fStack_1fb8);
        uStack_1e50 = CONCAT44(fStack_1fac,fStack_1fb0);
        uStack_1e48 = CONCAT44(0x3f37e013,fStack_1fa8);
        local_1e80 = CONCAT44(fStack_1f9c,local_1fa0);
        uStack_1e78 = CONCAT44(fStack_1f94,fStack_1f98);
        uStack_1e70 = CONCAT44(fStack_1f8c,fStack_1f90);
        uStack_1e68 = CONCAT44(uStack_1cc8._4_4_,fStack_1f88);
        local_1fc0 = local_1fc0 * local_1fa0;
        fStack_1fbc = fStack_1fbc * fStack_1f9c;
        fStack_1fb8 = fStack_1fb8 * fStack_1f98;
        fStack_1fb4 = fStack_1fb4 * fStack_1f94;
        fStack_1fb0 = fStack_1fb0 * fStack_1f90;
        fStack_1fac = fStack_1fac * fStack_1f8c;
        fStack_1fa8 = fStack_1fa8 * fStack_1f88;
        local_1ba0 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_1b98 = CONCAT44(fStack_1fb4,fStack_1fb8);
        uStack_1b90 = CONCAT44(fStack_1fac,fStack_1fb0);
        uStack_1b88 = CONCAT44(0x3f37e013,fStack_1fa8);
        local_1bc0 = local_1ee0._0_8_;
        uStack_1bb8 = local_1ee0._8_8_;
        uStack_1bb0 = local_1ee0._16_8_;
        uStack_1ba8 = local_1ee0._24_8_;
        local_1fc0 = local_1fc0 + (float)local_1ce0;
        fStack_1fbc = fStack_1fbc + local_1ce0._4_4_;
        fStack_1fb8 = fStack_1fb8 + (float)uStack_1cd8;
        fStack_1fb4 = fStack_1fb4 + uStack_1cd8._4_4_;
        fStack_1fb0 = fStack_1fb0 + (float)uStack_1cd0;
        fStack_1fac = fStack_1fac + uStack_1cd0._4_4_;
        fStack_1fa8 = fStack_1fa8 + (float)uStack_1cc8;
        local_1be0 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_1bd8 = CONCAT44(fStack_1fb4,fStack_1fb8);
        uStack_1bd0 = CONCAT44(fStack_1fac,fStack_1fb0);
        uStack_1bc8 = CONCAT44(uStack_1cc8._4_4_ + 0.71826285,fStack_1fa8);
        local_1c00 = 0x3f8000003f800000;
        uStack_1bf8 = 0x3f8000003f800000;
        uStack_1bf0 = 0x3f8000003f800000;
        uStack_1be8 = 0x3f8000003f800000;
        local_1fc0 = local_1fc0 + 1.0;
        fStack_1fbc = fStack_1fbc + 1.0;
        fStack_1fb8 = fStack_1fb8 + 1.0;
        fStack_1fb4 = fStack_1fb4 + 1.0;
        fStack_1fb0 = fStack_1fb0 + 1.0;
        fStack_1fac = fStack_1fac + 1.0;
        fStack_1fa8 = fStack_1fa8 + 1.0;
        fStack_1fa4 = uStack_1cc8._4_4_ + 0.71826285 + 1.0;
        local_f80 = local_1f20;
        uStack_f78 = uStack_1f18;
        uStack_f70 = uStack_1f10;
        uStack_f68 = uStack_1f08;
        local_1f40 = CONCAT44((int)local_1c60._4_4_,(int)(float)local_1c60);
        uStack_1f38 = CONCAT44((int)uStack_1c58._4_4_,(int)(float)uStack_1c58);
        uStack_1f30 = CONCAT44((int)uStack_1c50._4_4_,(int)(float)uStack_1c50);
        uStack_1f28 = CONCAT44((int)uStack_1c48._4_4_,(int)(float)uStack_1c48);
        local_d80 = local_1f40;
        uStack_d78 = uStack_1f38;
        uStack_d70 = uStack_1f30;
        uStack_d68 = uStack_1f28;
        local_da0 = 0x7f0000007f;
        uStack_d98 = 0x7f0000007f;
        uStack_d90 = 0x7f0000007f;
        uStack_d88 = 0x7f0000007f;
        local_e20 = local_1f40;
        uStack_e18 = uStack_1f38;
        uStack_e10 = uStack_1f30;
        uStack_e08 = uStack_1f28;
        local_e40 = 0x7f0000007f;
        uStack_e38 = 0x7f0000007f;
        uStack_e30 = 0x7f0000007f;
        uStack_e28 = 0x7f0000007f;
        local_dd0 = 0x7f0000007f;
        uStack_dc8 = 0x7f0000007f;
        local_de0 = 0x7f0000007f;
        uStack_dd8 = 0x7f0000007f;
        local_b60 = local_1f40;
        uStack_b58 = uStack_1f38;
        local_b70 = 0x7f0000007f;
        uStack_b68 = 0x7f0000007f;
        auVar27._8_8_ = uStack_1f38;
        auVar27._0_8_ = local_1f40;
        auVar3._8_8_ = 0x7f0000007f;
        auVar3._0_8_ = 0x7f0000007f;
        local_db0 = vpaddd_avx(auVar27,auVar3);
        local_b80 = uStack_1f30;
        uStack_b78 = uStack_1f28;
        local_b90 = 0x7f0000007f;
        uStack_b88 = 0x7f0000007f;
        auVar1._8_8_ = uStack_1f28;
        auVar1._0_8_ = uStack_1f30;
        auVar2._8_8_ = 0x7f0000007f;
        auVar2._0_8_ = 0x7f0000007f;
        local_dc0 = vpaddd_avx(auVar1,auVar2);
        local_e60 = local_db0._0_8_;
        uStack_e58 = local_db0._8_8_;
        uStack_e50 = local_dc0._0_8_;
        uStack_e48 = local_dc0._8_8_;
        local_e00 = local_db0._0_8_;
        uStack_df8 = local_db0._8_8_;
        uStack_df0 = local_dc0._0_8_;
        uStack_de8 = local_dc0._8_8_;
        local_c00 = local_db0._0_8_;
        uStack_bf8 = local_db0._8_8_;
        uStack_bf0 = local_dc0._0_8_;
        uStack_be8 = local_dc0._8_8_;
        local_c04 = 0x17;
        local_c80 = local_db0._0_8_;
        uStack_c78 = local_db0._8_8_;
        uStack_c70 = local_dc0._0_8_;
        uStack_c68 = local_dc0._8_8_;
        local_ae0 = local_db0._0_8_;
        uStack_ad8 = local_db0._8_8_;
        local_ae4 = 0x17;
        local_c20 = vpslld_avx(local_db0,ZEXT416(0x17));
        local_b00 = local_dc0._0_8_;
        uStack_af8 = local_dc0._8_8_;
        local_b04 = 0x17;
        local_c30 = vpslld_avx(local_dc0,ZEXT416(0x17));
        local_ca0 = local_c20._0_8_;
        uStack_c98 = local_c20._8_8_;
        uStack_c90 = local_c30._0_8_;
        uStack_c88 = local_c30._8_8_;
        local_c60 = local_c20._0_8_;
        uStack_c58 = local_c20._8_8_;
        uStack_c50 = local_c30._0_8_;
        uStack_c48 = local_c30._8_8_;
        local_1f40 = local_c20._0_8_;
        uStack_1f38 = local_c20._8_8_;
        uStack_1f30 = local_c30._0_8_;
        uStack_1f28 = local_c30._8_8_;
        local_bc0 = local_c20._0_8_;
        uStack_bb8 = local_c20._8_8_;
        uStack_bb0 = local_c30._0_8_;
        uStack_ba8 = local_c30._8_8_;
        local_1fe0 = local_c20._0_8_;
        uStack_1fd8 = local_c20._8_8_;
        uStack_1fd0 = local_c30._0_8_;
        uStack_1fc8 = local_c30._8_8_;
        local_1ea0._4_4_ = fStack_1fbc;
        local_1ea0._0_4_ = local_1fc0;
        local_1ea0._8_4_ = fStack_1fb8;
        local_1ea0._12_4_ = fStack_1fb4;
        local_1ea0._16_4_ = fStack_1fb0;
        local_1ea0._20_4_ = fStack_1fac;
        local_1ea0._24_4_ = fStack_1fa8;
        local_1ea0._28_4_ = fStack_1fa4;
        local_1ec0._0_4_ = local_c20._0_4_;
        local_1ec0._4_4_ = local_c20._4_4_;
        uStack_1eb8._0_4_ = local_c20._8_4_;
        uStack_1eb8._4_4_ = local_c20._12_4_;
        uStack_1eb0._0_4_ = local_c30._0_4_;
        uStack_1eb0._4_4_ = local_c30._4_4_;
        uStack_1ea8._0_4_ = local_c30._8_4_;
        local_1fc0 = local_1fc0 * (float)local_1ec0;
        fStack_1fbc = fStack_1fbc * local_1ec0._4_4_;
        fStack_1fb8 = fStack_1fb8 * (float)uStack_1eb8;
        fStack_1fb4 = fStack_1fb4 * uStack_1eb8._4_4_;
        fStack_1fb0 = fStack_1fb0 * (float)uStack_1eb0;
        fStack_1fac = fStack_1fac * uStack_1eb0._4_4_;
        fStack_1fa8 = fStack_1fa8 * (float)uStack_1ea8;
        local_2060 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_2058 = CONCAT44(fStack_1fb4,fStack_1fb8);
        uStack_2050 = CONCAT44(fStack_1fac,fStack_1fb0);
        uStack_2048 = CONCAT44(fStack_1fa4,fStack_1fa8);
        local_2040._0_4_ = local_1160._0_4_;
        local_2040._4_4_ = local_1160._4_4_;
        fStack_2038 = local_1160._8_4_;
        fStack_2034 = local_1160._12_4_;
        fStack_2030 = auStack_1150._0_4_;
        fStack_202c = auStack_1150._4_4_;
        fStack_2028 = auStack_1150._8_4_;
        fStack_2024 = auStack_1150._12_4_;
        local_20e0 = (float)local_2040._0_4_ + local_1fc0;
        fStack_20dc = (float)local_2040._4_4_ + fStack_1fbc;
        fStack_20d8 = fStack_2038 + fStack_1fb8;
        fStack_20d4 = fStack_2034 + fStack_1fb4;
        fStack_20d0 = fStack_2030 + fStack_1fb0;
        fStack_20cc = fStack_202c + fStack_1fac;
        fStack_20c8 = fStack_2028 + fStack_1fa8;
        fStack_20c4 = fStack_2024 + fStack_1fa4;
        auVar4._4_4_ = fStack_20dc;
        auVar4._0_4_ = local_20e0;
        auVar4._8_4_ = fStack_20d8;
        auVar4._12_4_ = fStack_20d4;
        auVar4._16_4_ = fStack_20d0;
        auVar4._20_4_ = fStack_20cc;
        auVar4._24_4_ = fStack_20c8;
        auVar4._28_4_ = fStack_20c4;
        _local_21c0 = vdivps_avx(local_20c0,auVar4);
        local_21a0._0_4_ = auVar52._0_4_;
        local_21a0._4_4_ = auVar52._4_4_;
        fStack_2198 = auVar52._8_4_;
        fStack_2194 = auVar52._12_4_;
        fStack_2190 = auVar52._16_4_;
        fStack_218c = auVar52._20_4_;
        fStack_2188 = (float)uStack_22a8;
        uStack_2184 = (undefined4)((ulong)uStack_22a8 >> 0x20);
        uStack_2324 = uStack_2184;
        local_2340 = (float)local_21a0._0_4_ * (float)local_21c0._0_4_;
        fStack_233c = (float)local_21a0._4_4_ * (float)local_21c0._4_4_;
        fStack_2338 = fStack_2198 * fStack_21b8;
        fStack_2334 = fStack_2194 * fStack_21b4;
        fStack_2330 = fStack_2190 * fStack_21b0;
        fStack_232c = fStack_218c * fStack_21ac;
        fStack_2328 = fStack_2188 * fStack_21a8;
        auVar6._4_4_ = fStack_233c;
        auVar6._0_4_ = local_2340;
        auVar6._8_4_ = fStack_2338;
        auVar6._12_4_ = fStack_2334;
        auVar6._16_4_ = fStack_2330;
        auVar6._20_4_ = fStack_232c;
        auVar6._24_4_ = fStack_2328;
        auVar6._28_4_ = uStack_2184;
        *local_24a0 = auVar6;
        local_24a0 = local_24a0 + 1;
        _local_21a0 = auVar11;
        local_2120 = auVar11;
        _local_2040 = local_20c0;
        _local_1f00 = auVar22;
        local_1ec0 = local_c20._0_8_;
        uStack_1eb8 = local_c20._8_8_;
        uStack_1eb0 = local_c30._0_8_;
        uStack_1ea8 = local_c30._8_8_;
        local_1ce0 = local_1d00;
        uStack_1cd8 = uStack_1cf8;
        uStack_1cd0 = uStack_1cf0;
        uStack_1cc8 = uStack_1ce8;
        local_1c60 = local_1f20;
        uStack_1c58 = uStack_1f18;
        uStack_1c50 = uStack_1f10;
        uStack_1c48 = uStack_1f08;
        local_1c20 = uVar7;
        uStack_1c18 = uVar8;
        uStack_1c10 = uVar9;
        uStack_1c08 = uVar10;
        local_1a40 = local_1b80;
        uStack_1a38 = uStack_1b78;
        uStack_1a30 = uStack_1b70;
        uStack_1a28 = uStack_1b68;
        uStack_1288 = uStack_22a8;
        local_11e0 = local_1200;
        local_113c = local_1140;
        local_1138 = local_1140;
        local_1134 = local_1140;
        local_1130 = local_1140;
        local_112c = local_1140;
        local_1128 = local_1140;
        local_1124 = local_1140;
      }
      for (; local_24ec + 3 < local_2380; local_24ec = local_24ec + 4) {
        local_2270 = local_24a0;
        local_2220 = *(undefined8 *)*local_24a0;
        uStack_2218 = *(undefined8 *)(*local_24a0 + 8);
        local_a20 = *(undefined1 (*) [16])*local_24a0;
        local_2248 = local_24a0;
        local_9f4 = 0x3f800000;
        local_a10 = 0x3f800000;
        local_a30 = 0x3f8000003f800000;
        uStack_a28 = 0x3f8000003f800000;
        local_9c0._8_8_ = 0x3f8000003f800000;
        local_9c0._0_8_ = 0x3f8000003f800000;
        local_1e0 = ZEXT816(0) << 0x20;
        local_220 = 0;
        local_1d0._8_8_ = SUB168(ZEXT816(0),4);
        uStack_218 = local_1d0._8_8_;
        auVar55._8_8_ = 0;
        auVar55._0_8_ = local_1d0._8_8_;
        auVar2 = vsubps_avx(auVar55 << 0x40,*(undefined1 (*) [16])*local_24a0);
        local_910 = 0x3f8000003f800000;
        uStack_908 = 0x3f8000003f800000;
        local_8d0._0_8_ = auVar2._0_8_;
        local_180 = local_8d0._0_8_;
        local_8d0._8_8_ = auVar2._8_8_;
        uStack_178 = local_8d0._8_8_;
        local_190 = 0x42b0c0a542b0c0a5;
        uStack_188 = 0x42b0c0a542b0c0a5;
        auVar43._8_8_ = 0x42b0c0a542b0c0a5;
        auVar43._0_8_ = 0x42b0c0a542b0c0a5;
        auVar2 = vminps_avx(auVar2,auVar43);
        local_8d0._0_8_ = auVar2._0_8_;
        local_140 = local_8d0._0_8_;
        local_8d0._8_8_ = auVar2._8_8_;
        uStack_138 = local_8d0._8_8_;
        local_150 = 0xc2b0c0a5c2b0c0a5;
        uStack_148 = 0xc2b0c0a5c2b0c0a5;
        auVar45._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar45._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar3 = vmaxps_avx(auVar2,auVar45);
        local_8d0._0_8_ = auVar3._0_8_;
        uVar7 = local_8d0._0_8_;
        local_8d0._8_8_ = auVar3._8_8_;
        uVar8 = local_8d0._8_8_;
        local_740 = 0x3fb8aa3b3fb8aa3b;
        uStack_738 = 0x3fb8aa3b3fb8aa3b;
        local_730._0_4_ = auVar3._0_4_;
        local_730._4_4_ = auVar3._4_4_;
        uStack_728._0_4_ = auVar3._8_4_;
        uStack_728._4_4_ = auVar3._12_4_;
        local_8f0._4_4_ = local_730._4_4_ * 1.442695;
        local_8f0._0_4_ = (float)local_730 * 1.442695;
        uStack_8e8._0_4_ = (float)uStack_728 * 1.442695;
        uStack_8e8._4_4_ = uStack_728._4_4_ * 1.442695;
        local_630 = local_8f0;
        uStack_628 = uStack_8e8;
        local_6e0 = 0x3f0000003f000000;
        uStack_6d8 = 0x3f0000003f000000;
        local_8f0._0_4_ = (float)local_730 * 1.442695 + 0.5;
        local_8f0._4_4_ = local_730._4_4_ * 1.442695 + 0.5;
        fVar59 = (float)uStack_728 * 1.442695 + 0.5;
        fVar60 = uStack_728._4_4_ * 1.442695 + 0.5;
        uStack_8e8._0_4_ = fVar59;
        uStack_8e8._4_4_ = fVar60;
        local_100 = local_8f0;
        uStack_f8 = uStack_8e8;
        local_900._4_4_ = (int)(float)local_8f0._4_4_;
        local_900._0_4_ = (int)(float)local_8f0._0_4_;
        local_900._8_4_ = (int)fVar59;
        local_900._12_4_ = (int)fVar60;
        local_e0 = local_900._0_8_;
        uStack_d8 = local_900._8_8_;
        auVar47._8_8_ = local_900._8_8_;
        auVar47._0_8_ = local_900._0_8_;
        auVar1 = vcvtdq2ps_avx(auVar47);
        local_8e0 = auVar1._0_8_;
        local_a0 = local_8e0;
        uStack_8d8 = auVar1._8_8_;
        uStack_98 = uStack_8d8;
        local_b0 = local_8f0;
        uStack_a8 = uStack_8e8;
        auVar49._8_8_ = uStack_8e8;
        auVar49._0_8_ = local_8f0;
        auVar2 = vcmpps_avx(auVar49,auVar1,1);
        local_920._0_8_ = auVar2._0_8_;
        local_60 = local_920._0_8_;
        local_920._8_8_ = auVar2._8_8_;
        uStack_58 = local_920._8_8_;
        local_70 = 0x3f8000003f800000;
        uStack_68 = 0x3f8000003f800000;
        auVar51._8_8_ = 0x3f8000003f800000;
        auVar51._0_8_ = 0x3f8000003f800000;
        local_920 = vpand_avx(auVar2,auVar51);
        local_240 = local_8e0;
        uStack_238 = uStack_8d8;
        local_250 = local_920._0_8_;
        uStack_248 = local_920._8_8_;
        _local_8f0 = vsubps_avx(auVar1,local_920);
        local_760 = 0x3f3180003f318000;
        uStack_758 = 0x3f3180003f318000;
        local_750._0_4_ = local_8f0._0_4_;
        local_750._4_4_ = local_8f0._4_4_;
        uStack_748._0_4_ = local_8f0._8_4_;
        uStack_748._4_4_ = local_8f0._12_4_;
        local_8e0 = CONCAT44(local_750._4_4_ * 0.6933594,(float)local_750 * 0.6933594);
        uStack_8d8._0_4_ = (float)uStack_748 * 0.6933594;
        uStack_8d8._4_4_ = uStack_748._4_4_ * 0.6933594;
        local_770 = local_8f0;
        uStack_768 = uStack_8e8;
        local_780 = 0xb95e8083b95e8083;
        uStack_778 = 0xb95e8083b95e8083;
        local_260 = local_8d0._0_8_;
        uStack_258 = local_8d0._8_8_;
        local_270 = local_8e0;
        uStack_268 = uStack_8d8;
        auVar41._8_8_ = uStack_8d8;
        auVar41._0_8_ = local_8e0;
        auVar2 = vsubps_avx(auVar3,auVar41);
        local_8d0._0_8_ = auVar2._0_8_;
        local_280 = local_8d0._0_8_;
        local_8d0._8_8_ = auVar2._8_8_;
        uStack_278 = local_8d0._8_8_;
        local_290 = CONCAT44(local_750._4_4_ * -0.00021219444,(float)local_750 * -0.00021219444);
        uStack_288 = CONCAT44(uStack_748._4_4_ * -0.00021219444,(float)uStack_748 * -0.00021219444);
        auVar40._8_8_ = uStack_288;
        auVar40._0_8_ = local_290;
        local_8d0 = vsubps_avx(auVar2,auVar40);
        local_7a0 = local_8d0._0_8_;
        uStack_798 = local_8d0._8_8_;
        local_790._0_4_ = local_8d0._0_4_;
        local_790._4_4_ = local_8d0._4_4_;
        uStack_788._0_4_ = local_8d0._8_4_;
        uStack_788._4_4_ = local_8d0._12_4_;
        local_930 = (float)local_790 * (float)local_790;
        fStack_92c = local_790._4_4_ * local_790._4_4_;
        fStack_928 = (float)uStack_788 * (float)uStack_788;
        fStack_924 = uStack_788._4_4_ * uStack_788._4_4_;
        local_7b0 = 0x3950696739506967;
        uStack_7a8 = 0x3950696739506967;
        local_7c0 = local_8d0._0_8_;
        uStack_7b8 = local_8d0._8_8_;
        local_650 = CONCAT44(local_790._4_4_ * 0.00019875691,(float)local_790 * 0.00019875691);
        uStack_648 = CONCAT44(uStack_788._4_4_ * 0.00019875691,(float)uStack_788 * 0.00019875691);
        local_660 = 0x3ab743ce3ab743ce;
        uStack_658 = 0x3ab743ce3ab743ce;
        local_940 = (float)local_790 * 0.00019875691 + 0.0013981999;
        fStack_93c = local_790._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_938 = (float)uStack_788 * 0.00019875691 + 0.0013981999;
        fStack_934 = uStack_788._4_4_ * 0.00019875691 + 0.0013981999;
        local_7d0 = CONCAT44(fStack_93c,local_940);
        uStack_7c8 = CONCAT44(fStack_934,fStack_938);
        local_7e0 = local_8d0._0_8_;
        uStack_7d8 = local_8d0._8_8_;
        local_940 = local_940 * (float)local_790;
        fStack_93c = fStack_93c * local_790._4_4_;
        fStack_938 = fStack_938 * (float)uStack_788;
        fStack_934 = fStack_934 * uStack_788._4_4_;
        local_670 = CONCAT44(fStack_93c,local_940);
        uStack_668 = CONCAT44(fStack_934,fStack_938);
        local_680 = 0x3c0889083c088908;
        uStack_678 = 0x3c0889083c088908;
        local_940 = local_940 + 0.008333452;
        fStack_93c = fStack_93c + 0.008333452;
        fStack_938 = fStack_938 + 0.008333452;
        fStack_934 = fStack_934 + 0.008333452;
        local_7f0 = CONCAT44(fStack_93c,local_940);
        uStack_7e8 = CONCAT44(fStack_934,fStack_938);
        local_800 = local_8d0._0_8_;
        uStack_7f8 = local_8d0._8_8_;
        local_940 = local_940 * (float)local_790;
        fStack_93c = fStack_93c * local_790._4_4_;
        fStack_938 = fStack_938 * (float)uStack_788;
        fStack_934 = fStack_934 * uStack_788._4_4_;
        local_690 = CONCAT44(fStack_93c,local_940);
        uStack_688 = CONCAT44(fStack_934,fStack_938);
        local_6a0 = 0x3d2aa9c13d2aa9c1;
        uStack_698 = 0x3d2aa9c13d2aa9c1;
        local_940 = local_940 + 0.041665796;
        fStack_93c = fStack_93c + 0.041665796;
        fStack_938 = fStack_938 + 0.041665796;
        fStack_934 = fStack_934 + 0.041665796;
        local_810 = CONCAT44(fStack_93c,local_940);
        uStack_808 = CONCAT44(fStack_934,fStack_938);
        local_820 = local_8d0._0_8_;
        uStack_818 = local_8d0._8_8_;
        local_940 = local_940 * (float)local_790;
        fStack_93c = fStack_93c * local_790._4_4_;
        fStack_938 = fStack_938 * (float)uStack_788;
        fStack_934 = fStack_934 * uStack_788._4_4_;
        local_6b0 = CONCAT44(fStack_93c,local_940);
        uStack_6a8 = CONCAT44(fStack_934,fStack_938);
        local_6c0 = 0x3e2aaaaa3e2aaaaa;
        uStack_6b8 = 0x3e2aaaaa3e2aaaaa;
        local_940 = local_940 + 0.16666666;
        fStack_93c = fStack_93c + 0.16666666;
        fStack_938 = fStack_938 + 0.16666666;
        fStack_934 = fStack_934 + 0.16666666;
        local_830 = CONCAT44(fStack_93c,local_940);
        uStack_828 = CONCAT44(fStack_934,fStack_938);
        local_840 = local_8d0._0_8_;
        uStack_838 = local_8d0._8_8_;
        local_940 = local_940 * (float)local_790;
        fStack_93c = fStack_93c * local_790._4_4_;
        fStack_938 = fStack_938 * (float)uStack_788;
        fStack_934 = fStack_934 * uStack_788._4_4_;
        local_6d0 = CONCAT44(fStack_93c,local_940);
        uStack_6c8 = CONCAT44(fStack_934,fStack_938);
        local_940 = local_940 + 0.5;
        fStack_93c = fStack_93c + 0.5;
        fStack_938 = fStack_938 + 0.5;
        fStack_934 = fStack_934 + 0.5;
        local_850 = CONCAT44(fStack_93c,local_940);
        uStack_848 = CONCAT44(fStack_934,fStack_938);
        local_860 = CONCAT44(fStack_92c,local_930);
        uStack_858 = CONCAT44(fStack_924,fStack_928);
        local_940 = local_940 * local_930;
        fStack_93c = fStack_93c * fStack_92c;
        fStack_938 = fStack_938 * fStack_928;
        fStack_934 = fStack_934 * fStack_924;
        local_6f0 = CONCAT44(fStack_93c,local_940);
        uStack_6e8 = CONCAT44(fStack_934,fStack_938);
        local_700 = local_8d0._0_8_;
        uStack_6f8 = local_8d0._8_8_;
        local_940 = local_940 + (float)local_790;
        fStack_93c = fStack_93c + local_790._4_4_;
        fStack_938 = fStack_938 + (float)uStack_788;
        fStack_934 = fStack_934 + uStack_788._4_4_;
        local_710 = CONCAT44(fStack_93c,local_940);
        uStack_708 = CONCAT44(fStack_934,fStack_938);
        local_720 = 0x3f8000003f800000;
        uStack_718 = 0x3f8000003f800000;
        local_940 = local_940 + 1.0;
        fStack_93c = fStack_93c + 1.0;
        fStack_938 = fStack_938 + 1.0;
        fStack_934 = fStack_934 + 1.0;
        local_110 = local_8f0;
        uStack_108 = uStack_8e8;
        local_900._4_4_ = (int)local_750._4_4_;
        local_900._0_4_ = (int)(float)local_750;
        local_900._8_4_ = (int)(float)uStack_748;
        local_900._12_4_ = (int)uStack_748._4_4_;
        local_8b0 = local_900._0_8_;
        uStack_8a8 = local_900._8_8_;
        local_8c0 = 0x7f0000007f;
        uStack_8b8 = 0x7f0000007f;
        auVar35._8_8_ = local_900._8_8_;
        auVar35._0_8_ = local_900._0_8_;
        auVar34._8_8_ = 0x7f0000007f;
        auVar34._0_8_ = 0x7f0000007f;
        auVar2 = vpaddd_avx(auVar35,auVar34);
        local_900._0_8_ = auVar2._0_8_;
        local_890 = local_900._0_8_;
        local_900._8_8_ = auVar2._8_8_;
        uStack_888 = local_900._8_8_;
        local_894 = 0x17;
        local_900 = vpslld_avx(auVar2,ZEXT416(0x17));
        local_40 = local_900._0_8_;
        uStack_38 = local_900._8_8_;
        local_950 = local_900._0_8_;
        uStack_948 = local_900._8_8_;
        local_870._4_4_ = fStack_93c;
        local_870._0_4_ = local_940;
        local_870._8_4_ = fStack_938;
        local_870._12_4_ = fStack_934;
        local_880._0_4_ = local_900._0_4_;
        local_880._4_4_ = local_900._4_4_;
        uStack_878._0_4_ = local_900._8_4_;
        uStack_878._4_4_ = local_900._12_4_;
        local_940 = local_940 * (float)local_880;
        fStack_93c = fStack_93c * local_880._4_4_;
        fStack_938 = fStack_938 * (float)uStack_878;
        fStack_934 = fStack_934 * uStack_878._4_4_;
        local_990 = CONCAT44(fStack_93c,local_940);
        uStack_988 = CONCAT44(fStack_934,fStack_938);
        local_9d0 = local_940 + 1.0;
        fStack_9cc = fStack_93c + 1.0;
        fStack_9c8 = fStack_938 + 1.0;
        fStack_9c4 = fStack_934 + 1.0;
        auVar32._4_4_ = fStack_9cc;
        auVar32._0_4_ = local_9d0;
        auVar32._8_4_ = fStack_9c8;
        auVar32._12_4_ = fStack_9c4;
        _local_a70 = vdivps_avx(local_9c0,auVar32);
        local_a60._0_4_ = (undefined4)local_2220;
        local_a60._4_4_ = (undefined4)((ulong)local_2220 >> 0x20);
        fStack_a58 = (float)uStack_2218;
        fStack_a54 = (float)((ulong)uStack_2218 >> 0x20);
        local_2260 = (float)local_a60._0_4_ * (float)local_a70._0_4_;
        fStack_225c = (float)local_a60._4_4_ * (float)local_a70._4_4_;
        fStack_2258 = fStack_a58 * fStack_a68;
        fStack_2254 = fStack_a54 * fStack_a64;
        auVar12._4_4_ = fStack_225c;
        auVar12._0_4_ = local_2260;
        auVar12._8_4_ = fStack_2258;
        auVar12._12_4_ = fStack_2254;
        *(undefined1 (*) [16])*local_24a0 = auVar12;
        local_24a0 = (undefined1 (*) [32])(*local_24a0 + 0x10);
        _local_a60 = local_a20;
        uStack_a0c = local_a10;
        uStack_a08 = local_a10;
        uStack_a04 = local_a10;
        local_980 = local_9c0;
        local_880 = local_900._0_8_;
        uStack_878 = local_900._8_8_;
        local_790 = local_7a0;
        uStack_788 = uStack_798;
        local_750 = local_8f0;
        uStack_748 = uStack_8e8;
        local_730 = uVar7;
        uStack_728 = uVar8;
        local_640 = local_6e0;
        uStack_638 = uStack_6d8;
        local_230 = local_2220;
        uStack_228 = uStack_2218;
        local_1d0 = local_1e0;
      }
      for (; local_24ec < local_2380; local_24ec = local_24ec + 1) {
        fVar59 = *(float *)*local_24a0;
        dVar58 = std::exp((double)(ulong)(*(uint *)*local_24a0 ^ 0x80000000));
        *(float *)*local_24a0 = fVar59 / (SUB84(dVar58,0) + 1.0);
        local_24a0 = (undefined1 (*) [32])(*local_24a0 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int Swish_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, swish_avx(_p));
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, swish_sse(_p));
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, swish_avx(_p));
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _mm_storeu_ps(ptr, swish_sse(_p));
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr / (1.f + exp(-*ptr));
            ptr++;
        }
    }

    return 0;
}